

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx2::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCRayQueryContext *pRVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  bool bVar61;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [12];
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  uint uVar108;
  int iVar109;
  uint uVar110;
  ulong uVar111;
  ulong uVar112;
  long lVar113;
  undefined1 auVar114 [8];
  uint uVar115;
  long lVar116;
  undefined4 uVar117;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  ulong uVar118;
  bool bVar119;
  float fVar120;
  float fVar149;
  float fVar151;
  undefined1 auVar122 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar123 [16];
  float fVar121;
  float fVar150;
  float fVar152;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar184;
  undefined8 uVar185;
  float fVar212;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar211;
  float fVar213;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar232;
  float fVar244;
  float fVar246;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar242;
  float fVar243;
  float fVar245;
  float fVar247;
  undefined1 auVar239 [32];
  undefined1 auVar238 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar263;
  undefined1 auVar262 [64];
  undefined1 auVar264 [16];
  float fVar277;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar278;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar281 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar279;
  float fVar287;
  float fVar288;
  undefined1 auVar280 [16];
  undefined1 auVar282 [16];
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar283 [28];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar295;
  undefined1 in_ZMM10 [64];
  undefined1 auVar294 [64];
  undefined1 auVar298 [32];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar299 [64];
  float fVar300;
  float fVar308;
  float fVar309;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [64];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  float P_err;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float fStack_bac;
  float fStack_ba8;
  float fStack_ba4;
  RTCFilterFunctionNArguments local_b70;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 auStack_ad0 [16];
  undefined1 (*local_ab0) [32];
  ulong local_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined1 local_960 [16];
  Primitive *local_950;
  ulong local_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  uint local_800;
  uint uStack_7fc;
  uint uStack_7f8;
  uint uStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined4 uStack_744;
  ulong local_740;
  undefined1 auStack_738 [24];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  uint local_600;
  uint uStack_5fc;
  uint uStack_5f8;
  uint uStack_5f4;
  uint uStack_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  uint local_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  uint uStack_5d0;
  uint uStack_5cc;
  uint uStack_5c8;
  uint uStack_5c4;
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  RTCHitN local_3e0 [32];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar286 [64];
  undefined1 auVar293 [16];
  
  PVar7 = prim[1];
  uVar118 = (ulong)(byte)PVar7;
  lVar113 = uVar118 * 0x25;
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar120 = *(float *)(prim + lVar113 + 0x12);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar113 + 6));
  auVar122._0_4_ = fVar120 * auVar15._0_4_;
  auVar122._4_4_ = fVar120 * auVar15._4_4_;
  auVar122._8_4_ = fVar120 * auVar15._8_4_;
  auVar122._12_4_ = fVar120 * auVar15._12_4_;
  auVar186._0_4_ = fVar120 * auVar16._0_4_;
  auVar186._4_4_ = fVar120 * auVar16._4_4_;
  auVar186._8_4_ = fVar120 * auVar16._8_4_;
  auVar186._12_4_ = fVar120 * auVar16._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar118 * 4 + 6);
  auVar168 = vpmovsxbd_avx2(auVar15);
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar118 * 5 + 6);
  auVar133 = vpmovsxbd_avx2(auVar16);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar118 * 6 + 6);
  auVar144 = vpmovsxbd_avx2(auVar2);
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar118 * 0xf + 6);
  auVar18 = vpmovsxbd_avx2(auVar3);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar19 = vpmovsxbd_avx2(auVar4);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar118 + 6);
  auVar143 = vpmovsxbd_avx2(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar118 * 0x1a + 6);
  auVar20 = vpmovsxbd_avx2(auVar6);
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar281._8_8_ = 0;
  auVar281._0_8_ = *(ulong *)(prim + uVar118 * 0x1b + 6);
  auVar273 = vpmovsxbd_avx2(auVar281);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar118 * 0x1c + 6);
  auVar21 = vpmovsxbd_avx2(auVar129);
  auVar273 = vcvtdq2ps_avx(auVar273);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar199._4_4_ = auVar186._0_4_;
  auVar199._0_4_ = auVar186._0_4_;
  auVar199._8_4_ = auVar186._0_4_;
  auVar199._12_4_ = auVar186._0_4_;
  auVar199._16_4_ = auVar186._0_4_;
  auVar199._20_4_ = auVar186._0_4_;
  auVar199._24_4_ = auVar186._0_4_;
  auVar199._28_4_ = auVar186._0_4_;
  auVar15 = vmovshdup_avx(auVar186);
  uVar185 = auVar15._0_8_;
  auVar321._8_8_ = uVar185;
  auVar321._0_8_ = uVar185;
  auVar321._16_8_ = uVar185;
  auVar321._24_8_ = uVar185;
  auVar15 = vshufps_avx(auVar186,auVar186,0xaa);
  fVar120 = auVar15._0_4_;
  auVar286._0_4_ = fVar120 * auVar144._0_4_;
  fVar149 = auVar15._4_4_;
  auVar286._4_4_ = fVar149 * auVar144._4_4_;
  auVar286._8_4_ = fVar120 * auVar144._8_4_;
  auVar286._12_4_ = fVar149 * auVar144._12_4_;
  auVar286._16_4_ = fVar120 * auVar144._16_4_;
  auVar286._20_4_ = fVar149 * auVar144._20_4_;
  auVar286._28_36_ = in_ZMM11._28_36_;
  auVar286._24_4_ = fVar120 * auVar144._24_4_;
  auVar262._0_4_ = auVar143._0_4_ * fVar120;
  auVar262._4_4_ = auVar143._4_4_ * fVar149;
  auVar262._8_4_ = auVar143._8_4_ * fVar120;
  auVar262._12_4_ = auVar143._12_4_ * fVar149;
  auVar262._16_4_ = auVar143._16_4_ * fVar120;
  auVar262._20_4_ = auVar143._20_4_ * fVar149;
  auVar262._28_36_ = in_ZMM10._28_36_;
  auVar262._24_4_ = auVar143._24_4_ * fVar120;
  auVar260._0_4_ = auVar21._0_4_ * fVar120;
  auVar260._4_4_ = auVar21._4_4_ * fVar149;
  auVar260._8_4_ = auVar21._8_4_ * fVar120;
  auVar260._12_4_ = auVar21._12_4_ * fVar149;
  auVar260._16_4_ = auVar21._16_4_ * fVar120;
  auVar260._20_4_ = auVar21._20_4_ * fVar149;
  auVar260._24_4_ = auVar21._24_4_ * fVar120;
  auVar260._28_4_ = 0;
  auVar15 = vfmadd231ps_fma(auVar286._0_32_,auVar321,auVar133);
  auVar16 = vfmadd231ps_fma(auVar262._0_32_,auVar321,auVar19);
  auVar2 = vfmadd231ps_fma(auVar260,auVar273,auVar321);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar199,auVar168);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar199,auVar18);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar20,auVar199);
  auVar265._4_4_ = auVar122._0_4_;
  auVar265._0_4_ = auVar122._0_4_;
  auVar265._8_4_ = auVar122._0_4_;
  auVar265._12_4_ = auVar122._0_4_;
  auVar265._16_4_ = auVar122._0_4_;
  auVar265._20_4_ = auVar122._0_4_;
  auVar265._24_4_ = auVar122._0_4_;
  auVar265._28_4_ = auVar122._0_4_;
  auVar15 = vmovshdup_avx(auVar122);
  uVar185 = auVar15._0_8_;
  auVar322._8_8_ = uVar185;
  auVar322._0_8_ = uVar185;
  auVar322._16_8_ = uVar185;
  auVar322._24_8_ = uVar185;
  auVar15 = vshufps_avx(auVar122,auVar122,0xaa);
  fVar120 = auVar15._0_4_;
  auVar197._0_4_ = fVar120 * auVar144._0_4_;
  fVar149 = auVar15._4_4_;
  auVar197._4_4_ = fVar149 * auVar144._4_4_;
  auVar197._8_4_ = fVar120 * auVar144._8_4_;
  auVar197._12_4_ = fVar149 * auVar144._12_4_;
  auVar197._16_4_ = fVar120 * auVar144._16_4_;
  auVar197._20_4_ = fVar149 * auVar144._20_4_;
  auVar197._24_4_ = fVar120 * auVar144._24_4_;
  auVar197._28_4_ = 0;
  auVar17._4_4_ = auVar143._4_4_ * fVar149;
  auVar17._0_4_ = auVar143._0_4_ * fVar120;
  auVar17._8_4_ = auVar143._8_4_ * fVar120;
  auVar17._12_4_ = auVar143._12_4_ * fVar149;
  auVar17._16_4_ = auVar143._16_4_ * fVar120;
  auVar17._20_4_ = auVar143._20_4_ * fVar149;
  auVar17._24_4_ = auVar143._24_4_ * fVar120;
  auVar17._28_4_ = auVar144._28_4_;
  auVar144._4_4_ = auVar21._4_4_ * fVar149;
  auVar144._0_4_ = auVar21._0_4_ * fVar120;
  auVar144._8_4_ = auVar21._8_4_ * fVar120;
  auVar144._12_4_ = auVar21._12_4_ * fVar149;
  auVar144._16_4_ = auVar21._16_4_ * fVar120;
  auVar144._20_4_ = auVar21._20_4_ * fVar149;
  auVar144._24_4_ = auVar21._24_4_ * fVar120;
  auVar144._28_4_ = fVar149;
  auVar15 = vfmadd231ps_fma(auVar197,auVar322,auVar133);
  auVar4 = vfmadd231ps_fma(auVar17,auVar322,auVar19);
  auVar5 = vfmadd231ps_fma(auVar144,auVar322,auVar273);
  auVar122 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar265,auVar168);
  local_8e0._8_4_ = 0x7fffffff;
  local_8e0._0_8_ = 0x7fffffff7fffffff;
  local_8e0._12_4_ = 0x7fffffff;
  local_8e0._16_4_ = 0x7fffffff;
  local_8e0._20_4_ = 0x7fffffff;
  local_8e0._24_4_ = 0x7fffffff;
  local_8e0._28_4_ = 0x7fffffff;
  auVar310._8_4_ = 0x219392ef;
  auVar310._0_8_ = 0x219392ef219392ef;
  auVar310._12_4_ = 0x219392ef;
  auVar310._16_4_ = 0x219392ef;
  auVar310._20_4_ = 0x219392ef;
  auVar310._24_4_ = 0x219392ef;
  auVar310._28_4_ = 0x219392ef;
  auVar168 = vandps_avx(ZEXT1632(auVar3),local_8e0);
  auVar168 = vcmpps_avx(auVar168,auVar310,1);
  auVar133 = vblendvps_avx(ZEXT1632(auVar3),auVar310,auVar168);
  auVar168 = vandps_avx(ZEXT1632(auVar16),local_8e0);
  auVar168 = vcmpps_avx(auVar168,auVar310,1);
  auVar144 = vblendvps_avx(ZEXT1632(auVar16),auVar310,auVar168);
  auVar168 = vandps_avx(ZEXT1632(auVar2),local_8e0);
  auVar168 = vcmpps_avx(auVar168,auVar310,1);
  auVar168 = vblendvps_avx(ZEXT1632(auVar2),auVar310,auVar168);
  auVar186 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar265,auVar18);
  auVar123 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar265,auVar20);
  fVar120 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar113 + 0x16)) *
            *(float *)(prim + lVar113 + 0x1a);
  auVar135._4_4_ = fVar120;
  auVar135._0_4_ = fVar120;
  auVar135._8_4_ = fVar120;
  auVar135._12_4_ = fVar120;
  auVar135._16_4_ = fVar120;
  auVar135._20_4_ = fVar120;
  auVar135._24_4_ = fVar120;
  auVar135._28_4_ = fVar120;
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 7 + 6));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 0xb + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar143 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 9 + 6));
  auVar3 = vfmadd213ps_fma(auVar19,auVar135,auVar18);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 0xd + 6));
  auVar18 = vcvtdq2ps_avx(auVar143);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar4 = vfmadd213ps_fma(auVar19,auVar135,auVar18);
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 0x12 + 6));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar111 = (ulong)(uint)((int)(uVar118 * 5) << 2);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 2 + uVar111 + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar143 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 + 6));
  auVar5 = vfmadd213ps_fma(auVar19,auVar135,auVar18);
  auVar18 = vcvtdq2ps_avx(auVar143);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 0x18 + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar6 = vfmadd213ps_fma(auVar19,auVar135,auVar18);
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 0x1d + 6));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 + (ulong)(byte)PVar7 * 0x20 + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar281 = vfmadd213ps_fma(auVar19,auVar135,auVar18);
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar7 * 0x20 - uVar118) + 6))
  ;
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar118 * 0x23 + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar129 = vfmadd213ps_fma(auVar19,auVar135,auVar18);
  auVar18 = vrcpps_avx(auVar133);
  auVar301._8_4_ = 0x3f800000;
  auVar301._0_8_ = &DAT_3f8000003f800000;
  auVar301._12_4_ = 0x3f800000;
  auVar301._16_4_ = 0x3f800000;
  auVar301._20_4_ = 0x3f800000;
  auVar301._24_4_ = 0x3f800000;
  auVar301._28_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar133,auVar18,auVar301);
  auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar18,auVar18);
  auVar133 = vrcpps_avx(auVar144);
  auVar16 = vfnmadd213ps_fma(auVar144,auVar133,auVar301);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar133,auVar133);
  auVar133 = vrcpps_avx(auVar168);
  auVar2 = vfnmadd213ps_fma(auVar168,auVar133,auVar301);
  auVar2 = vfmadd132ps_fma(ZEXT1632(auVar2),auVar133,auVar133);
  auVar168 = vsubps_avx(ZEXT1632(auVar3),ZEXT1632(auVar122));
  auVar133 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar122));
  auVar18._4_4_ = auVar15._4_4_ * auVar168._4_4_;
  auVar18._0_4_ = auVar15._0_4_ * auVar168._0_4_;
  auVar18._8_4_ = auVar15._8_4_ * auVar168._8_4_;
  auVar18._12_4_ = auVar15._12_4_ * auVar168._12_4_;
  auVar18._16_4_ = auVar168._16_4_ * 0.0;
  auVar18._20_4_ = auVar168._20_4_ * 0.0;
  auVar18._24_4_ = auVar168._24_4_ * 0.0;
  auVar18._28_4_ = auVar168._28_4_;
  auVar19._4_4_ = auVar15._4_4_ * auVar133._4_4_;
  auVar19._0_4_ = auVar15._0_4_ * auVar133._0_4_;
  auVar19._8_4_ = auVar15._8_4_ * auVar133._8_4_;
  auVar19._12_4_ = auVar15._12_4_ * auVar133._12_4_;
  auVar19._16_4_ = auVar133._16_4_ * 0.0;
  auVar19._20_4_ = auVar133._20_4_ * 0.0;
  auVar19._24_4_ = auVar133._24_4_ * 0.0;
  auVar19._28_4_ = auVar133._28_4_;
  auVar168 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar186));
  auVar133 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar186));
  auVar143._4_4_ = auVar16._4_4_ * auVar168._4_4_;
  auVar143._0_4_ = auVar16._0_4_ * auVar168._0_4_;
  auVar143._8_4_ = auVar16._8_4_ * auVar168._8_4_;
  auVar143._12_4_ = auVar16._12_4_ * auVar168._12_4_;
  auVar143._16_4_ = auVar168._16_4_ * 0.0;
  auVar143._20_4_ = auVar168._20_4_ * 0.0;
  auVar143._24_4_ = auVar168._24_4_ * 0.0;
  auVar143._28_4_ = auVar168._28_4_;
  auVar20._4_4_ = auVar16._4_4_ * auVar133._4_4_;
  auVar20._0_4_ = auVar16._0_4_ * auVar133._0_4_;
  auVar20._8_4_ = auVar16._8_4_ * auVar133._8_4_;
  auVar20._12_4_ = auVar16._12_4_ * auVar133._12_4_;
  auVar20._16_4_ = auVar133._16_4_ * 0.0;
  auVar20._20_4_ = auVar133._20_4_ * 0.0;
  auVar20._24_4_ = auVar133._24_4_ * 0.0;
  auVar20._28_4_ = auVar133._28_4_;
  auVar168 = vsubps_avx(ZEXT1632(auVar281),ZEXT1632(auVar123));
  auVar273._4_4_ = auVar2._4_4_ * auVar168._4_4_;
  auVar273._0_4_ = auVar2._0_4_ * auVar168._0_4_;
  auVar273._8_4_ = auVar2._8_4_ * auVar168._8_4_;
  auVar273._12_4_ = auVar2._12_4_ * auVar168._12_4_;
  auVar273._16_4_ = auVar168._16_4_ * 0.0;
  auVar273._20_4_ = auVar168._20_4_ * 0.0;
  auVar273._24_4_ = auVar168._24_4_ * 0.0;
  auVar273._28_4_ = auVar168._28_4_;
  auVar168 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar123));
  auVar21._4_4_ = auVar2._4_4_ * auVar168._4_4_;
  auVar21._0_4_ = auVar2._0_4_ * auVar168._0_4_;
  auVar21._8_4_ = auVar2._8_4_ * auVar168._8_4_;
  auVar21._12_4_ = auVar2._12_4_ * auVar168._12_4_;
  auVar21._16_4_ = auVar168._16_4_ * 0.0;
  auVar21._20_4_ = auVar168._20_4_ * 0.0;
  auVar21._24_4_ = auVar168._24_4_ * 0.0;
  auVar21._28_4_ = auVar168._28_4_;
  auVar168 = vpminsd_avx2(auVar18,auVar19);
  auVar133 = vpminsd_avx2(auVar143,auVar20);
  auVar168 = vmaxps_avx(auVar168,auVar133);
  auVar133 = vpminsd_avx2(auVar273,auVar21);
  uVar117 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar266._4_4_ = uVar117;
  auVar266._0_4_ = uVar117;
  auVar266._8_4_ = uVar117;
  auVar266._12_4_ = uVar117;
  auVar266._16_4_ = uVar117;
  auVar266._20_4_ = uVar117;
  auVar266._24_4_ = uVar117;
  auVar266._28_4_ = uVar117;
  auVar133 = vmaxps_avx(auVar133,auVar266);
  auVar168 = vmaxps_avx(auVar168,auVar133);
  local_280._4_4_ = auVar168._4_4_ * 0.99999964;
  local_280._0_4_ = auVar168._0_4_ * 0.99999964;
  local_280._8_4_ = auVar168._8_4_ * 0.99999964;
  local_280._12_4_ = auVar168._12_4_ * 0.99999964;
  local_280._16_4_ = auVar168._16_4_ * 0.99999964;
  local_280._20_4_ = auVar168._20_4_ * 0.99999964;
  local_280._24_4_ = auVar168._24_4_ * 0.99999964;
  local_280._28_4_ = auVar168._28_4_;
  auVar168 = vpmaxsd_avx2(auVar18,auVar19);
  auVar133 = vpmaxsd_avx2(auVar143,auVar20);
  auVar168 = vminps_avx(auVar168,auVar133);
  auVar133 = vpmaxsd_avx2(auVar273,auVar21);
  uVar117 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar198._4_4_ = uVar117;
  auVar198._0_4_ = uVar117;
  auVar198._8_4_ = uVar117;
  auVar198._12_4_ = uVar117;
  auVar198._16_4_ = uVar117;
  auVar198._20_4_ = uVar117;
  auVar198._24_4_ = uVar117;
  auVar198._28_4_ = uVar117;
  auVar133 = vminps_avx(auVar133,auVar198);
  auVar168 = vminps_avx(auVar168,auVar133);
  auVar285._4_4_ = auVar168._4_4_ * 1.0000004;
  auVar285._0_4_ = auVar168._0_4_ * 1.0000004;
  auVar285._8_4_ = auVar168._8_4_ * 1.0000004;
  auVar285._12_4_ = auVar168._12_4_ * 1.0000004;
  auVar285._16_4_ = auVar168._16_4_ * 1.0000004;
  auVar285._20_4_ = auVar168._20_4_ * 1.0000004;
  auVar285._24_4_ = auVar168._24_4_ * 1.0000004;
  auVar285._28_4_ = auVar168._28_4_;
  auVar168._1_3_ = 0;
  auVar168[0] = PVar7;
  auVar168[4] = PVar7;
  auVar168._5_3_ = 0;
  auVar168[8] = PVar7;
  auVar168._9_3_ = 0;
  auVar168[0xc] = PVar7;
  auVar168._13_3_ = 0;
  auVar168[0x10] = PVar7;
  auVar168._17_3_ = 0;
  auVar168[0x14] = PVar7;
  auVar168._21_3_ = 0;
  auVar168[0x18] = PVar7;
  auVar168._25_3_ = 0;
  auVar168[0x1c] = PVar7;
  auVar168._29_3_ = 0;
  auVar133 = vpcmpgtd_avx2(auVar168,_DAT_0205a920);
  auVar168 = vcmpps_avx(local_280,auVar285,2);
  auVar168 = vandps_avx(auVar168,auVar133);
  uVar108 = vmovmskps_avx(auVar168);
  if (uVar108 == 0) {
    return;
  }
  uVar108 = uVar108 & 0xff;
  auVar133._16_16_ = mm_lookupmask_ps._240_16_;
  auVar133._0_16_ = mm_lookupmask_ps._240_16_;
  local_240 = vblendps_avx(auVar133,ZEXT832(0) << 0x20,0x80);
  local_ab0 = (undefined1 (*) [32])&local_300;
  iVar109 = 1 << ((uint)k & 0x1f);
  auVar134._4_4_ = iVar109;
  auVar134._0_4_ = iVar109;
  auVar134._8_4_ = iVar109;
  auVar134._12_4_ = iVar109;
  auVar134._16_4_ = iVar109;
  auVar134._20_4_ = iVar109;
  auVar134._24_4_ = iVar109;
  auVar134._28_4_ = iVar109;
  auVar133 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar168 = vpand_avx2(auVar134,auVar133);
  local_620 = vpcmpeqd_avx2(auVar168,auVar133);
  local_800 = 0x80000000;
  uStack_7fc = 0x80000000;
  uStack_7f8 = 0x80000000;
  uStack_7f4 = 0x80000000;
  fStack_7f0 = -0.0;
  fStack_7ec = -0.0;
  fStack_7e8 = -0.0;
  fStack_7e4 = -0.0;
  local_950 = prim;
LAB_01958e22:
  lVar113 = 0;
  local_948 = (ulong)uVar108;
  for (uVar118 = local_948; (uVar118 & 1) == 0; uVar118 = uVar118 >> 1 | 0x8000000000000000) {
    lVar113 = lVar113 + 1;
  }
  uVar108 = *(uint *)(local_950 + 2);
  local_600 = *(uint *)(local_950 + lVar113 * 4 + 6);
  local_aa8 = (ulong)local_600;
  pGVar9 = (context->scene->geometries).items[uVar108].ptr;
  uVar118 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                            local_aa8 *
                            pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar120 = (pGVar9->time_range).lower;
  fVar120 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar120) / ((pGVar9->time_range).upper - fVar120));
  auVar15 = vroundss_avx(ZEXT416((uint)fVar120),ZEXT416((uint)fVar120),9);
  auVar15 = vminss_avx(auVar15,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar15 = vmaxss_avx(ZEXT816(0) << 0x20,auVar15);
  fVar120 = fVar120 - auVar15._0_4_;
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar116 = (long)(int)auVar15._0_4_ * 0x38;
  lVar113 = *(long *)(_Var10 + 0x10 + lVar116);
  lVar11 = *(long *)(_Var10 + 0x38 + lVar116);
  lVar12 = *(long *)(_Var10 + 0x48 + lVar116);
  pfVar1 = (float *)(lVar11 + uVar118 * lVar12);
  auVar123._0_4_ = fVar120 * *pfVar1;
  auVar123._4_4_ = fVar120 * pfVar1[1];
  auVar123._8_4_ = fVar120 * pfVar1[2];
  auVar123._12_4_ = fVar120 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + (uVar118 + 1) * lVar12);
  auVar164._0_4_ = fVar120 * *pfVar1;
  auVar164._4_4_ = fVar120 * pfVar1[1];
  auVar164._8_4_ = fVar120 * pfVar1[2];
  auVar164._12_4_ = fVar120 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + (uVar118 + 2) * lVar12);
  auVar158._0_4_ = fVar120 * *pfVar1;
  auVar158._4_4_ = fVar120 * pfVar1[1];
  auVar158._8_4_ = fVar120 * pfVar1[2];
  auVar158._12_4_ = fVar120 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + lVar12 * (uVar118 + 3));
  auVar195._0_4_ = fVar120 * *pfVar1;
  auVar195._4_4_ = fVar120 * pfVar1[1];
  auVar195._8_4_ = fVar120 * pfVar1[2];
  auVar195._12_4_ = fVar120 * pfVar1[3];
  lVar11 = *(long *)(_Var10 + lVar116);
  fVar120 = 1.0 - fVar120;
  auVar187._4_4_ = fVar120;
  auVar187._0_4_ = fVar120;
  auVar187._8_4_ = fVar120;
  auVar187._12_4_ = fVar120;
  auVar3 = vfmadd231ps_fma(auVar123,auVar187,*(undefined1 (*) [16])(lVar11 + lVar113 * uVar118));
  auVar4 = vfmadd231ps_fma(auVar164,auVar187,
                           *(undefined1 (*) [16])(lVar11 + lVar113 * (uVar118 + 1)));
  auVar5 = vfmadd231ps_fma(auVar158,auVar187,
                           *(undefined1 (*) [16])(lVar11 + lVar113 * (uVar118 + 2)));
  auVar6 = vfmadd231ps_fma(auVar195,auVar187,
                           *(undefined1 (*) [16])(lVar11 + lVar113 * (uVar118 + 3)));
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar16 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar117 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar264._4_4_ = uVar117;
  auVar264._0_4_ = uVar117;
  auVar264._8_4_ = uVar117;
  auVar264._12_4_ = uVar117;
  fStack_850 = (float)uVar117;
  _local_860 = auVar264;
  fStack_84c = (float)uVar117;
  fStack_848 = (float)uVar117;
  register0x0000141c = uVar117;
  uVar117 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar280._4_4_ = uVar117;
  auVar280._0_4_ = uVar117;
  auVar280._8_4_ = uVar117;
  auVar280._12_4_ = uVar117;
  fStack_890 = (float)uVar117;
  _local_8a0 = auVar280;
  fStack_88c = (float)uVar117;
  fStack_888 = (float)uVar117;
  register0x0000145c = uVar117;
  auVar286 = ZEXT3264(_local_8a0);
  auVar15 = vunpcklps_avx(auVar264,auVar280);
  fVar120 = *(float *)(ray + k * 4 + 0xc0);
  auVar293._4_4_ = fVar120;
  auVar293._0_4_ = fVar120;
  auVar293._8_4_ = fVar120;
  auVar293._12_4_ = fVar120;
  fStack_8b0 = fVar120;
  _local_8c0 = auVar293;
  fStack_8ac = fVar120;
  fStack_8a8 = fVar120;
  uStack_8a4 = fVar120;
  auVar294 = ZEXT3264(_local_8c0);
  local_a50 = vinsertps_avx(auVar15,auVar293,0x28);
  auVar299 = ZEXT1664(local_a50);
  auVar248._0_4_ = (auVar3._0_4_ + auVar4._0_4_ + auVar5._0_4_ + auVar6._0_4_) * 0.25;
  auVar248._4_4_ = (auVar3._4_4_ + auVar4._4_4_ + auVar5._4_4_ + auVar6._4_4_) * 0.25;
  auVar248._8_4_ = (auVar3._8_4_ + auVar4._8_4_ + auVar5._8_4_ + auVar6._8_4_) * 0.25;
  auVar248._12_4_ = (auVar3._12_4_ + auVar4._12_4_ + auVar5._12_4_ + auVar6._12_4_) * 0.25;
  auVar15 = vsubps_avx(auVar248,auVar16);
  auVar15 = vdpps_avx(auVar15,local_a50,0x7f);
  local_a60 = vdpps_avx(local_a50,local_a50,0x7f);
  auVar307 = ZEXT1664(local_a60);
  auVar2 = vrcpss_avx(local_a60,local_a60);
  auVar281 = vfnmadd213ss_fma(auVar2,local_a60,ZEXT416(0x40000000));
  local_260 = auVar15._0_4_ * auVar2._0_4_ * auVar281._0_4_;
  auVar254._4_4_ = local_260;
  auVar254._0_4_ = local_260;
  auVar254._8_4_ = local_260;
  auVar254._12_4_ = local_260;
  fStack_810 = local_260;
  _local_820 = auVar254;
  fStack_80c = local_260;
  fStack_808 = local_260;
  fStack_804 = local_260;
  auVar15 = vfmadd231ps_fma(auVar16,local_a50,auVar254);
  auVar15 = vblendps_avx(auVar15,_DAT_01feba10,8);
  auVar2 = vsubps_avx(auVar3,auVar15);
  auVar3 = vsubps_avx(auVar5,auVar15);
  auVar4 = vsubps_avx(auVar4,auVar15);
  auVar5 = vsubps_avx(auVar6,auVar15);
  auVar15 = vmovshdup_avx(auVar2);
  local_1a0 = auVar15._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar15 = vshufps_avx(auVar2,auVar2,0xaa);
  local_1c0 = auVar15._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar15 = vshufps_avx(auVar2,auVar2,0xff);
  local_440 = auVar15._0_8_;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  auVar15 = vmovshdup_avx(auVar4);
  local_460 = auVar15._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar15 = vshufps_avx(auVar4,auVar4,0xaa);
  local_480 = auVar15._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar15 = vshufps_avx(auVar4,auVar4,0xff);
  local_4a0 = auVar15._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar15 = vmovshdup_avx(auVar3);
  local_1e0 = auVar15._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar15 = vshufps_avx(auVar3,auVar3,0xaa);
  local_200 = auVar15._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar15 = vshufps_avx(auVar3,auVar3,0xff);
  local_4c0 = auVar15._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar15 = vmovshdup_avx(auVar5);
  local_4e0 = auVar15._0_8_;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  auVar15 = vshufps_avx(auVar5,auVar5,0xaa);
  local_500 = auVar15._0_8_;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  auVar15 = vshufps_avx(auVar5,auVar5,0xff);
  local_520 = auVar15._0_8_;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  auVar15 = vfmadd231ps_fma(ZEXT432((uint)(fVar120 * fVar120)),_local_8a0,_local_8a0);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),_local_860,_local_860);
  uVar117 = auVar15._0_4_;
  local_220._4_4_ = uVar117;
  local_220._0_4_ = uVar117;
  local_220._8_4_ = uVar117;
  local_220._12_4_ = uVar117;
  local_220._16_4_ = uVar117;
  local_220._20_4_ = uVar117;
  local_220._24_4_ = uVar117;
  local_220._28_4_ = uVar117;
  auVar262 = ZEXT3264(local_220);
  fVar120 = *(float *)(ray + k * 4 + 0x60);
  local_960 = ZEXT416((uint)local_260);
  local_260 = fVar120 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_5e0 = uVar108;
  uStack_5dc = uVar108;
  uStack_5d8 = uVar108;
  uStack_5d4 = uVar108;
  uStack_5d0 = uVar108;
  uStack_5cc = uVar108;
  uStack_5c8 = uVar108;
  uStack_5c4 = uVar108;
  uStack_5fc = local_600;
  uStack_5f8 = local_600;
  uStack_5f4 = local_600;
  uStack_5f0 = local_600;
  uStack_5ec = local_600;
  uStack_5e8 = local_600;
  uStack_5e4 = local_600;
  uVar111 = 0;
  uVar118 = 1;
  local_540 = auVar2._0_4_;
  uStack_53c = local_540;
  uStack_538 = local_540;
  uStack_534 = local_540;
  uStack_530 = local_540;
  uStack_52c = local_540;
  uStack_528 = local_540;
  uStack_524 = local_540;
  local_560 = auVar4._0_4_;
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  local_580 = auVar3._0_4_;
  uStack_57c = local_580;
  uStack_578 = local_580;
  uStack_574 = local_580;
  uStack_570 = local_580;
  uStack_56c = local_580;
  uStack_568 = local_580;
  uStack_564 = local_580;
  fVar149 = auVar5._0_4_;
  local_5a0 = fVar149;
  fStack_59c = fVar149;
  fStack_598 = fVar149;
  fStack_594 = fVar149;
  fStack_590 = fVar149;
  fStack_58c = fVar149;
  fStack_588 = fVar149;
  fStack_584 = fVar149;
  local_5c0 = vandps_avx(local_220,local_8e0);
  auVar15 = vsqrtss_avx(local_a60,local_a60);
  auVar16 = vsqrtss_avx(local_a60,local_a60);
  local_970 = 0x3f80000000000000;
  uStack_968 = 0;
  auVar201._8_4_ = 0x3f800000;
  auVar201._0_8_ = &DAT_3f8000003f800000;
  auVar201._12_4_ = 0x3f800000;
  auVar201._16_4_ = 0x3f800000;
  auVar201._20_4_ = 0x3f800000;
  auVar201._24_4_ = 0x3f800000;
  auVar201._28_4_ = 0x3f800000;
  do {
    auVar85._8_8_ = uStack_968;
    auVar85._0_8_ = local_970;
    auVar6 = vmovshdup_avx(auVar85);
    fVar232 = (float)local_970;
    fVar247 = auVar6._0_4_ - fVar232;
    fVar278 = fVar247 * 0.04761905;
    local_a00._4_4_ = fVar232;
    local_a00._0_4_ = fVar232;
    local_a00._8_4_ = fVar232;
    local_a00._12_4_ = fVar232;
    local_a00._16_4_ = fVar232;
    local_a00._20_4_ = fVar232;
    local_a00._24_4_ = fVar232;
    local_a00._28_4_ = fVar232;
    local_aa0._4_4_ = fVar247;
    local_aa0._0_4_ = fVar247;
    local_aa0._8_4_ = fVar247;
    local_aa0._12_4_ = fVar247;
    local_aa0._16_4_ = fVar247;
    local_aa0._20_4_ = fVar247;
    local_aa0._24_4_ = fVar247;
    local_aa0._28_4_ = fVar247;
    auVar6 = vfmadd231ps_fma(local_a00,local_aa0,_DAT_02020f20);
    auVar168 = vsubps_avx(auVar201,ZEXT1632(auVar6));
    fVar232 = auVar168._0_4_;
    fVar243 = auVar168._4_4_;
    fVar308 = auVar168._8_4_;
    fVar244 = auVar168._12_4_;
    fVar277 = auVar168._16_4_;
    fVar246 = auVar168._20_4_;
    fVar300 = auVar168._24_4_;
    fVar121 = fVar232 * fVar232 * fVar232;
    fVar150 = fVar243 * fVar243 * fVar243;
    fVar151 = fVar308 * fVar308 * fVar308;
    fVar152 = fVar244 * fVar244 * fVar244;
    fVar153 = fVar277 * fVar277 * fVar277;
    fVar154 = fVar246 * fVar246 * fVar246;
    fVar155 = fVar300 * fVar300 * fVar300;
    fVar242 = auVar6._0_4_;
    fVar245 = auVar6._4_4_;
    fVar309 = auVar6._8_4_;
    fVar263 = auVar6._12_4_;
    fVar184 = fVar242 * fVar242 * fVar242;
    fVar211 = fVar245 * fVar245 * fVar245;
    fVar212 = fVar309 * fVar309 * fVar309;
    fVar213 = fVar263 * fVar263 * fVar263;
    fVar279 = fVar232 * fVar242;
    fVar287 = fVar243 * fVar245;
    fVar288 = fVar308 * fVar309;
    fVar289 = fVar244 * fVar263;
    fVar290 = fVar277 * 0.0;
    fVar291 = fVar246 * 0.0;
    fVar292 = fVar300 * 0.0;
    fVar295 = auVar294._28_4_ + auVar307._28_4_;
    auVar22._4_4_ = fVar150 * 0.16666667;
    auVar22._0_4_ = fVar121 * 0.16666667;
    auVar22._8_4_ = fVar151 * 0.16666667;
    auVar22._12_4_ = fVar152 * 0.16666667;
    auVar22._16_4_ = fVar153 * 0.16666667;
    auVar22._20_4_ = fVar154 * 0.16666667;
    auVar22._24_4_ = fVar155 * 0.16666667;
    auVar22._28_4_ = fVar295 + fVar247;
    auVar23._4_4_ =
         (fVar243 * fVar287 * 12.0 + fVar287 * fVar245 * 6.0 + fVar211 + fVar150 * 4.0) * 0.16666667
    ;
    auVar23._0_4_ =
         (fVar232 * fVar279 * 12.0 + fVar279 * fVar242 * 6.0 + fVar184 + fVar121 * 4.0) * 0.16666667
    ;
    auVar23._8_4_ =
         (fVar308 * fVar288 * 12.0 + fVar288 * fVar309 * 6.0 + fVar212 + fVar151 * 4.0) * 0.16666667
    ;
    auVar23._12_4_ =
         (fVar244 * fVar289 * 12.0 + fVar289 * fVar263 * 6.0 + fVar213 + fVar152 * 4.0) * 0.16666667
    ;
    auVar23._16_4_ =
         (fVar277 * fVar290 * 12.0 + fVar290 * 0.0 * 6.0 + fVar153 * 4.0 + 0.0) * 0.16666667;
    auVar23._20_4_ =
         (fVar246 * fVar291 * 12.0 + fVar291 * 0.0 * 6.0 + fVar154 * 4.0 + 0.0) * 0.16666667;
    auVar23._24_4_ =
         (fVar300 * fVar292 * 12.0 + fVar292 * 0.0 * 6.0 + fVar155 * 4.0 + 0.0) * 0.16666667;
    auVar23._28_4_ = auVar299._28_4_;
    auVar24._4_4_ =
         (fVar211 * 4.0 + fVar150 + fVar287 * fVar245 * 12.0 + fVar243 * fVar287 * 6.0) * 0.16666667
    ;
    auVar24._0_4_ =
         (fVar184 * 4.0 + fVar121 + fVar279 * fVar242 * 12.0 + fVar232 * fVar279 * 6.0) * 0.16666667
    ;
    auVar24._8_4_ =
         (fVar212 * 4.0 + fVar151 + fVar288 * fVar309 * 12.0 + fVar308 * fVar288 * 6.0) * 0.16666667
    ;
    auVar24._12_4_ =
         (fVar213 * 4.0 + fVar152 + fVar289 * fVar263 * 12.0 + fVar244 * fVar289 * 6.0) * 0.16666667
    ;
    auVar24._16_4_ = (fVar153 + 0.0 + fVar290 * 0.0 * 12.0 + fVar277 * fVar290 * 6.0) * 0.16666667;
    auVar24._20_4_ = (fVar154 + 0.0 + fVar291 * 0.0 * 12.0 + fVar246 * fVar291 * 6.0) * 0.16666667;
    auVar24._24_4_ = (fVar155 + 0.0 + fVar292 * 0.0 * 12.0 + fVar300 * fVar292 * 6.0) * 0.16666667;
    auVar24._28_4_ = auVar307._28_4_;
    fVar184 = fVar184 * 0.16666667;
    fVar211 = fVar211 * 0.16666667;
    fVar212 = fVar212 * 0.16666667;
    fVar213 = fVar213 * 0.16666667;
    auVar25._4_4_ = fVar211 * fStack_59c;
    auVar25._0_4_ = fVar184 * local_5a0;
    auVar25._8_4_ = fVar212 * fStack_598;
    auVar25._12_4_ = fVar213 * fStack_594;
    auVar25._16_4_ = fStack_590 * 0.0;
    auVar25._20_4_ = fStack_58c * 0.0;
    auVar25._24_4_ = fStack_588 * 0.0;
    auVar25._28_4_ = fVar247;
    auVar26._4_4_ = fVar211 * local_4e0._4_4_;
    auVar26._0_4_ = fVar184 * (float)local_4e0;
    auVar26._8_4_ = fVar212 * (float)uStack_4d8;
    auVar26._12_4_ = fVar213 * uStack_4d8._4_4_;
    auVar26._16_4_ = (float)uStack_4d0 * 0.0;
    auVar26._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar26._24_4_ = (float)uStack_4c8 * 0.0;
    auVar26._28_4_ = 0x40800000;
    auVar27._4_4_ = fVar211 * local_500._4_4_;
    auVar27._0_4_ = fVar184 * (float)local_500;
    auVar27._8_4_ = fVar212 * (float)uStack_4f8;
    auVar27._12_4_ = fVar213 * uStack_4f8._4_4_;
    auVar27._16_4_ = (float)uStack_4f0 * 0.0;
    auVar27._20_4_ = uStack_4f0._4_4_ * 0.0;
    auVar27._24_4_ = (float)uStack_4e8 * 0.0;
    auVar27._28_4_ = fStack_7e4;
    auVar28._4_4_ = fVar211 * local_520._4_4_;
    auVar28._0_4_ = fVar184 * (float)local_520;
    auVar28._8_4_ = fVar212 * (float)uStack_518;
    auVar28._12_4_ = fVar213 * uStack_518._4_4_;
    auVar28._16_4_ = (float)uStack_510 * 0.0;
    auVar28._20_4_ = uStack_510._4_4_ * 0.0;
    auVar28._24_4_ = (float)uStack_508 * 0.0;
    auVar28._28_4_ = fVar295 + fStack_7e4 + 0.0;
    auVar87._4_4_ = uStack_57c;
    auVar87._0_4_ = local_580;
    auVar87._8_4_ = uStack_578;
    auVar87._12_4_ = uStack_574;
    auVar87._16_4_ = uStack_570;
    auVar87._20_4_ = uStack_56c;
    auVar87._24_4_ = uStack_568;
    auVar87._28_4_ = uStack_564;
    auVar6 = vfmadd231ps_fma(auVar25,auVar24,auVar87);
    auVar105._8_8_ = uStack_1d8;
    auVar105._0_8_ = local_1e0;
    auVar105._16_8_ = uStack_1d0;
    auVar105._24_8_ = uStack_1c8;
    auVar281 = vfmadd231ps_fma(auVar26,auVar24,auVar105);
    auVar104._8_8_ = uStack_1f8;
    auVar104._0_8_ = local_200;
    auVar104._16_8_ = uStack_1f0;
    auVar104._24_8_ = uStack_1e8;
    auVar129 = vfmadd231ps_fma(auVar27,auVar24,auVar104);
    auVar93._8_8_ = uStack_4b8;
    auVar93._0_8_ = local_4c0;
    auVar93._16_8_ = uStack_4b0;
    auVar93._24_8_ = uStack_4a8;
    auVar122 = vfmadd231ps_fma(auVar28,auVar24,auVar93);
    auVar89._4_4_ = uStack_55c;
    auVar89._0_4_ = local_560;
    auVar89._8_4_ = uStack_558;
    auVar89._12_4_ = uStack_554;
    auVar89._16_4_ = uStack_550;
    auVar89._20_4_ = uStack_54c;
    auVar89._24_4_ = uStack_548;
    auVar89._28_4_ = uStack_544;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar23,auVar89);
    auVar99._8_8_ = uStack_458;
    auVar99._0_8_ = local_460;
    auVar99._16_8_ = uStack_450;
    auVar99._24_8_ = uStack_448;
    auVar281 = vfmadd231ps_fma(ZEXT1632(auVar281),auVar23,auVar99);
    auVar97._8_8_ = uStack_478;
    auVar97._0_8_ = local_480;
    auVar97._16_8_ = uStack_470;
    auVar97._24_8_ = uStack_468;
    auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar23,auVar97);
    auVar95._8_8_ = uStack_498;
    auVar95._0_8_ = local_4a0;
    auVar95._16_8_ = uStack_490;
    auVar95._24_8_ = uStack_488;
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar23,auVar95);
    auVar91._4_4_ = uStack_53c;
    auVar91._0_4_ = local_540;
    auVar91._8_4_ = uStack_538;
    auVar91._12_4_ = uStack_534;
    auVar91._16_4_ = uStack_530;
    auVar91._20_4_ = uStack_52c;
    auVar91._24_4_ = uStack_528;
    auVar91._28_4_ = uStack_524;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar22,auVar91);
    auVar135 = ZEXT1632(auVar6);
    auVar107._8_8_ = uStack_198;
    auVar107._0_8_ = local_1a0;
    auVar107._16_8_ = uStack_190;
    auVar107._24_8_ = uStack_188;
    auVar281 = vfmadd231ps_fma(ZEXT1632(auVar281),auVar22,auVar107);
    auVar106._8_8_ = uStack_1b8;
    auVar106._0_8_ = local_1c0;
    auVar106._16_8_ = uStack_1b0;
    auVar106._24_8_ = uStack_1a8;
    auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar22,auVar106);
    auVar101._8_8_ = uStack_438;
    auVar101._0_8_ = local_440;
    auVar101._16_8_ = uStack_430;
    auVar101._24_8_ = uStack_428;
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar22,auVar101);
    auVar255._0_4_ = (float)((uint)fVar242 ^ local_800) * fVar242;
    auVar255._4_4_ = (float)((uint)fVar245 ^ uStack_7fc) * fVar245;
    auVar255._8_4_ = (float)((uint)fVar309 ^ uStack_7f8) * fVar309;
    auVar255._12_4_ = (float)((uint)fVar263 ^ uStack_7f4) * fVar263;
    auVar255._16_4_ = fStack_7f0 * 0.0;
    auVar255._20_4_ = fStack_7ec * 0.0;
    auVar255._24_4_ = fStack_7e8 * 0.0;
    auVar255._28_4_ = 0;
    auVar29._4_4_ = fVar287 * 4.0;
    auVar29._0_4_ = fVar279 * 4.0;
    auVar29._8_4_ = fVar288 * 4.0;
    auVar29._12_4_ = fVar289 * 4.0;
    auVar29._16_4_ = fVar290 * 4.0;
    auVar29._20_4_ = fVar291 * 4.0;
    fVar247 = auVar286._28_4_;
    auVar29._24_4_ = fVar292 * 4.0;
    auVar29._28_4_ = fVar247;
    auVar133 = vsubps_avx(auVar255,auVar29);
    auVar30._4_4_ = fVar243 * (float)((uint)fVar243 ^ uStack_7fc) * 0.5;
    auVar30._0_4_ = fVar232 * (float)((uint)fVar232 ^ local_800) * 0.5;
    auVar30._8_4_ = fVar308 * (float)((uint)fVar308 ^ uStack_7f8) * 0.5;
    auVar30._12_4_ = fVar244 * (float)((uint)fVar244 ^ uStack_7f4) * 0.5;
    auVar30._16_4_ = fVar277 * (float)((uint)fVar277 ^ (uint)fStack_7f0) * 0.5;
    auVar30._20_4_ = fVar246 * (float)((uint)fVar246 ^ (uint)fStack_7ec) * 0.5;
    auVar30._24_4_ = fVar300 * (float)((uint)fVar300 ^ (uint)fStack_7e8) * 0.5;
    auVar30._28_4_ = auVar168._28_4_;
    auVar31._4_4_ = auVar133._4_4_ * 0.5;
    auVar31._0_4_ = auVar133._0_4_ * 0.5;
    auVar31._8_4_ = auVar133._8_4_ * 0.5;
    auVar31._12_4_ = auVar133._12_4_ * 0.5;
    auVar31._16_4_ = auVar133._16_4_ * 0.5;
    auVar31._20_4_ = auVar133._20_4_ * 0.5;
    auVar31._24_4_ = auVar133._24_4_ * 0.5;
    auVar31._28_4_ = auVar133._28_4_;
    auVar32._4_4_ = (fVar287 * 4.0 + fVar243 * fVar243) * 0.5;
    auVar32._0_4_ = (fVar279 * 4.0 + fVar232 * fVar232) * 0.5;
    auVar32._8_4_ = (fVar288 * 4.0 + fVar308 * fVar308) * 0.5;
    auVar32._12_4_ = (fVar289 * 4.0 + fVar244 * fVar244) * 0.5;
    auVar32._16_4_ = (fVar290 * 4.0 + fVar277 * fVar277) * 0.5;
    auVar32._20_4_ = (fVar291 * 4.0 + fVar246 * fVar246) * 0.5;
    auVar32._24_4_ = (fVar292 * 4.0 + fVar300 * fVar300) * 0.5;
    auVar32._28_4_ = fVar247 + auVar262._28_4_;
    fVar232 = fVar242 * fVar242 * 0.5;
    fVar242 = fVar245 * fVar245 * 0.5;
    fVar243 = fVar309 * fVar309 * 0.5;
    fVar245 = fVar263 * fVar263 * 0.5;
    auVar33._4_4_ = fVar242 * fStack_59c;
    auVar33._0_4_ = fVar232 * local_5a0;
    auVar33._8_4_ = fVar243 * fStack_598;
    auVar33._12_4_ = fVar245 * fStack_594;
    auVar33._16_4_ = fStack_590 * 0.0;
    auVar33._20_4_ = fStack_58c * 0.0;
    auVar33._24_4_ = fStack_588 * 0.0;
    auVar33._28_4_ = fVar247;
    auVar34._4_4_ = fVar242 * local_4e0._4_4_;
    auVar34._0_4_ = fVar232 * (float)local_4e0;
    auVar34._8_4_ = fVar243 * (float)uStack_4d8;
    auVar34._12_4_ = fVar245 * uStack_4d8._4_4_;
    auVar34._16_4_ = (float)uStack_4d0 * 0.0;
    auVar34._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar34._24_4_ = (float)uStack_4c8 * 0.0;
    auVar34._28_4_ = fStack_7e4;
    auVar35._4_4_ = fVar242 * local_500._4_4_;
    auVar35._0_4_ = fVar232 * (float)local_500;
    auVar35._8_4_ = fVar243 * (float)uStack_4f8;
    auVar35._12_4_ = fVar245 * uStack_4f8._4_4_;
    auVar35._16_4_ = (float)uStack_4f0 * 0.0;
    auVar35._20_4_ = uStack_4f0._4_4_ * 0.0;
    auVar35._24_4_ = (float)uStack_4e8 * 0.0;
    auVar35._28_4_ = auVar299._28_4_;
    auVar36._4_4_ = fVar242 * local_520._4_4_;
    auVar36._0_4_ = fVar232 * (float)local_520;
    auVar36._8_4_ = fVar243 * (float)uStack_518;
    auVar36._12_4_ = fVar245 * uStack_518._4_4_;
    auVar36._16_4_ = (float)uStack_510 * 0.0;
    auVar36._20_4_ = uStack_510._4_4_ * 0.0;
    auVar36._24_4_ = (float)uStack_508 * 0.0;
    auVar36._28_4_ = auVar201._28_4_;
    auVar88._4_4_ = uStack_57c;
    auVar88._0_4_ = local_580;
    auVar88._8_4_ = uStack_578;
    auVar88._12_4_ = uStack_574;
    auVar88._16_4_ = uStack_570;
    auVar88._20_4_ = uStack_56c;
    auVar88._24_4_ = uStack_568;
    auVar88._28_4_ = uStack_564;
    auVar6 = vfmadd231ps_fma(auVar33,auVar32,auVar88);
    auVar186 = vfmadd231ps_fma(auVar34,auVar32,auVar105);
    auVar123 = vfmadd231ps_fma(auVar35,auVar32,auVar104);
    auVar94._8_8_ = uStack_4b8;
    auVar94._0_8_ = local_4c0;
    auVar94._16_8_ = uStack_4b0;
    auVar94._24_8_ = uStack_4a8;
    auVar164 = vfmadd231ps_fma(auVar36,auVar32,auVar94);
    auVar90._4_4_ = uStack_55c;
    auVar90._0_4_ = local_560;
    auVar90._8_4_ = uStack_558;
    auVar90._12_4_ = uStack_554;
    auVar90._16_4_ = uStack_550;
    auVar90._20_4_ = uStack_54c;
    auVar90._24_4_ = uStack_548;
    auVar90._28_4_ = uStack_544;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar31,auVar90);
    auVar100._8_8_ = uStack_458;
    auVar100._0_8_ = local_460;
    auVar100._16_8_ = uStack_450;
    auVar100._24_8_ = uStack_448;
    auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar31,auVar100);
    auVar98._8_8_ = uStack_478;
    auVar98._0_8_ = local_480;
    auVar98._16_8_ = uStack_470;
    auVar98._24_8_ = uStack_468;
    auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar31,auVar98);
    auVar96._8_8_ = uStack_498;
    auVar96._0_8_ = local_4a0;
    auVar96._16_8_ = uStack_490;
    auVar96._24_8_ = uStack_488;
    auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar31,auVar96);
    auVar92._4_4_ = uStack_53c;
    auVar92._0_4_ = local_540;
    auVar92._8_4_ = uStack_538;
    auVar92._12_4_ = uStack_534;
    auVar92._16_4_ = uStack_530;
    auVar92._20_4_ = uStack_52c;
    auVar92._24_4_ = uStack_528;
    auVar92._28_4_ = uStack_524;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar30,auVar92);
    auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar30,auVar107);
    auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar30,auVar106);
    auVar102._8_8_ = uStack_438;
    auVar102._0_8_ = local_440;
    auVar102._16_8_ = uStack_430;
    auVar102._24_8_ = uStack_428;
    auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar30,auVar102);
    auVar283._0_4_ = auVar6._0_4_ * fVar278;
    auVar283._4_4_ = auVar6._4_4_ * fVar278;
    auVar283._8_4_ = auVar6._8_4_ * fVar278;
    auVar283._12_4_ = auVar6._12_4_ * fVar278;
    auVar283._16_4_ = fVar278 * 0.0;
    auVar283._20_4_ = fVar278 * 0.0;
    auVar283._24_4_ = fVar278 * 0.0;
    local_9c0._28_4_ = 0;
    local_9c0._0_28_ = auVar283;
    fVar242 = auVar186._0_4_ * fVar278;
    fVar243 = auVar186._4_4_ * fVar278;
    local_b00._4_4_ = fVar243;
    local_b00._0_4_ = fVar242;
    fVar308 = auVar186._8_4_ * fVar278;
    local_b00._8_4_ = fVar308;
    fVar309 = auVar186._12_4_ * fVar278;
    local_b00._12_4_ = fVar309;
    local_b00._16_4_ = fVar278 * 0.0;
    local_b00._20_4_ = fVar278 * 0.0;
    local_b00._24_4_ = fVar278 * 0.0;
    local_b00._28_4_ = (int)((ulong)uStack_188 >> 0x20);
    local_780._0_4_ = auVar123._0_4_ * fVar278;
    local_780._4_4_ = auVar123._4_4_ * fVar278;
    local_780._8_4_ = auVar123._8_4_ * fVar278;
    local_780._12_4_ = auVar123._12_4_ * fVar278;
    local_780._16_4_ = fVar278 * 0.0;
    local_780._20_4_ = fVar278 * 0.0;
    local_780._24_4_ = fVar278 * 0.0;
    local_780._28_4_ = 0;
    auVar239._0_4_ = fVar278 * auVar164._0_4_;
    auVar239._4_4_ = fVar278 * auVar164._4_4_;
    auVar239._8_4_ = fVar278 * auVar164._8_4_;
    auVar239._12_4_ = fVar278 * auVar164._12_4_;
    auVar239._16_4_ = fVar278 * 0.0;
    auVar239._20_4_ = fVar278 * 0.0;
    auVar239._24_4_ = fVar278 * 0.0;
    auVar239._28_4_ = 0;
    auVar197 = vpermps_avx2(_DAT_0205d4a0,auVar135);
    auVar198 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar281));
    _local_ae0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar129));
    auVar19 = vsubps_avx(auVar197,auVar135);
    auVar143 = vsubps_avx(_local_ae0,ZEXT1632(auVar129));
    fVar232 = auVar143._0_4_;
    fVar245 = auVar143._4_4_;
    auVar37._4_4_ = auVar283._4_4_ * fVar245;
    auVar37._0_4_ = auVar283._0_4_ * fVar232;
    fVar244 = auVar143._8_4_;
    auVar37._8_4_ = auVar283._8_4_ * fVar244;
    fVar246 = auVar143._12_4_;
    auVar37._12_4_ = auVar283._12_4_ * fVar246;
    fVar247 = auVar143._16_4_;
    auVar37._16_4_ = auVar283._16_4_ * fVar247;
    fVar150 = auVar143._20_4_;
    auVar37._20_4_ = auVar283._20_4_ * fVar150;
    fVar152 = auVar143._24_4_;
    auVar37._24_4_ = auVar283._24_4_ * fVar152;
    auVar37._28_4_ = 0;
    auVar6 = vfmsub231ps_fma(auVar37,local_780,auVar19);
    auVar20 = vsubps_avx(auVar198,ZEXT1632(auVar281));
    fVar292 = auVar19._0_4_;
    fVar295 = auVar19._4_4_;
    auVar38._4_4_ = fVar295 * fVar243;
    auVar38._0_4_ = fVar292 * fVar242;
    fVar316 = auVar19._8_4_;
    auVar38._8_4_ = fVar316 * fVar308;
    fVar317 = auVar19._12_4_;
    auVar38._12_4_ = fVar317 * fVar309;
    fVar318 = auVar19._16_4_;
    auVar38._16_4_ = fVar318 * fVar278 * 0.0;
    fVar319 = auVar19._20_4_;
    auVar38._20_4_ = fVar319 * fVar278 * 0.0;
    fVar320 = auVar19._24_4_;
    auVar38._24_4_ = fVar320 * fVar278 * 0.0;
    auVar38._28_4_ = auVar197._28_4_;
    auVar186 = vfmsub231ps_fma(auVar38,local_9c0,auVar20);
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar186._12_4_ * auVar186._12_4_,
                                                CONCAT48(auVar186._8_4_ * auVar186._8_4_,
                                                         CONCAT44(auVar186._4_4_ * auVar186._4_4_,
                                                                  auVar186._0_4_ * auVar186._0_4_)))
                                     ),ZEXT1632(auVar6),ZEXT1632(auVar6));
    fVar211 = auVar20._0_4_;
    fVar212 = auVar20._4_4_;
    auVar39._4_4_ = fVar212 * local_780._4_4_;
    auVar39._0_4_ = fVar211 * local_780._0_4_;
    fVar213 = auVar20._8_4_;
    auVar39._8_4_ = fVar213 * local_780._8_4_;
    fVar279 = auVar20._12_4_;
    auVar39._12_4_ = fVar279 * local_780._12_4_;
    fVar287 = auVar20._16_4_;
    auVar39._16_4_ = fVar287 * local_780._16_4_;
    fVar288 = auVar20._20_4_;
    auVar39._20_4_ = fVar288 * local_780._20_4_;
    fVar289 = auVar20._24_4_;
    auVar39._24_4_ = fVar289 * local_780._24_4_;
    auVar39._28_4_ = auVar198._28_4_;
    auVar123 = vfmsub231ps_fma(auVar39,local_b00,auVar143);
    auVar256._0_4_ = fVar232 * fVar232;
    auVar256._4_4_ = fVar245 * fVar245;
    auVar256._8_4_ = fVar244 * fVar244;
    auVar256._12_4_ = fVar246 * fVar246;
    auVar256._16_4_ = fVar247 * fVar247;
    auVar256._20_4_ = fVar150 * fVar150;
    auVar256._24_4_ = fVar152 * fVar152;
    auVar256._28_4_ = 0;
    auVar186 = vfmadd231ps_fma(auVar256,auVar20,auVar20);
    auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar19,auVar19);
    auVar168 = vrcpps_avx(ZEXT1632(auVar186));
    auVar123 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar123),ZEXT1632(auVar123));
    auVar311._8_4_ = 0x3f800000;
    auVar311._0_8_ = &DAT_3f8000003f800000;
    auVar311._12_4_ = 0x3f800000;
    auVar311._16_4_ = 0x3f800000;
    auVar311._20_4_ = 0x3f800000;
    auVar311._24_4_ = 0x3f800000;
    auVar311._28_4_ = 0x3f800000;
    auVar6 = vfnmadd213ps_fma(auVar168,ZEXT1632(auVar186),auVar311);
    auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar168,auVar168);
    local_b20 = vpermps_avx2(_DAT_0205d4a0,local_9c0);
    local_a80 = vpermps_avx2(_DAT_0205d4a0,local_780);
    auVar40._4_4_ = local_b20._4_4_ * fVar245;
    auVar40._0_4_ = local_b20._0_4_ * fVar232;
    auVar40._8_4_ = local_b20._8_4_ * fVar244;
    auVar40._12_4_ = local_b20._12_4_ * fVar246;
    auVar40._16_4_ = local_b20._16_4_ * fVar247;
    auVar40._20_4_ = local_b20._20_4_ * fVar150;
    auVar40._24_4_ = local_b20._24_4_ * fVar152;
    auVar40._28_4_ = auVar168._28_4_;
    auVar164 = vfmsub231ps_fma(auVar40,local_a80,auVar19);
    local_9e0 = vpermps_avx2(_DAT_0205d4a0,local_b00);
    auVar41._4_4_ = fVar295 * local_9e0._4_4_;
    auVar41._0_4_ = fVar292 * local_9e0._0_4_;
    auVar41._8_4_ = fVar316 * local_9e0._8_4_;
    auVar41._12_4_ = fVar317 * local_9e0._12_4_;
    auVar41._16_4_ = fVar318 * local_9e0._16_4_;
    auVar41._20_4_ = fVar319 * local_9e0._20_4_;
    auVar41._24_4_ = fVar320 * local_9e0._24_4_;
    auVar41._28_4_ = 0;
    auVar187 = vfmsub231ps_fma(auVar41,local_b20,auVar20);
    auVar164 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar187._12_4_ * auVar187._12_4_,
                                                  CONCAT48(auVar187._8_4_ * auVar187._8_4_,
                                                           CONCAT44(auVar187._4_4_ * auVar187._4_4_,
                                                                    auVar187._0_4_ * auVar187._0_4_)
                                                          ))),ZEXT1632(auVar164),ZEXT1632(auVar164))
    ;
    fVar242 = local_a80._0_4_;
    auVar267._0_4_ = fVar211 * fVar242;
    fVar308 = local_a80._4_4_;
    auVar267._4_4_ = fVar212 * fVar308;
    fVar263 = local_a80._8_4_;
    auVar267._8_4_ = fVar213 * fVar263;
    fVar300 = local_a80._12_4_;
    auVar267._12_4_ = fVar279 * fVar300;
    fVar121 = local_a80._16_4_;
    auVar267._16_4_ = fVar287 * fVar121;
    fVar151 = local_a80._20_4_;
    auVar267._20_4_ = fVar288 * fVar151;
    fVar153 = local_a80._24_4_;
    auVar267._24_4_ = fVar289 * fVar153;
    auVar267._28_4_ = 0;
    auVar187 = vfmsub231ps_fma(auVar267,local_9e0,auVar143);
    auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),ZEXT1632(auVar187),ZEXT1632(auVar187));
    auVar168 = vmaxps_avx(ZEXT1632(CONCAT412(auVar123._12_4_ * auVar6._12_4_,
                                             CONCAT48(auVar123._8_4_ * auVar6._8_4_,
                                                      CONCAT44(auVar123._4_4_ * auVar6._4_4_,
                                                               auVar123._0_4_ * auVar6._0_4_)))),
                          ZEXT1632(CONCAT412(auVar164._12_4_ * auVar6._12_4_,
                                             CONCAT48(auVar164._8_4_ * auVar6._8_4_,
                                                      CONCAT44(auVar164._4_4_ * auVar6._4_4_,
                                                               auVar164._0_4_ * auVar6._0_4_)))));
    local_7a0._0_4_ = auVar239._0_4_ + auVar122._0_4_;
    local_7a0._4_4_ = auVar239._4_4_ + auVar122._4_4_;
    local_7a0._8_4_ = auVar239._8_4_ + auVar122._8_4_;
    local_7a0._12_4_ = auVar239._12_4_ + auVar122._12_4_;
    local_7a0._16_4_ = auVar239._16_4_ + 0.0;
    local_7a0._20_4_ = auVar239._20_4_ + 0.0;
    local_7a0._24_4_ = auVar239._24_4_ + 0.0;
    local_7a0._28_4_ = 0;
    auVar133 = vsubps_avx(ZEXT1632(auVar122),auVar239);
    local_7c0 = vpermps_avx2(_DAT_0205d4a0,auVar133);
    local_a20 = ZEXT1632(auVar122);
    local_7e0 = vpermps_avx2(_DAT_0205d4a0,local_a20);
    auVar133 = vmaxps_avx(local_a20,local_7a0);
    auVar144 = vmaxps_avx(local_7c0,local_7e0);
    auVar18 = vrsqrtps_avx(ZEXT1632(auVar186));
    auVar144 = vmaxps_avx(auVar133,auVar144);
    uVar117 = auVar133._28_4_;
    fVar243 = auVar18._0_4_;
    fVar309 = auVar18._4_4_;
    fVar277 = auVar18._8_4_;
    fVar278 = auVar18._12_4_;
    fVar154 = auVar18._16_4_;
    fVar155 = auVar18._20_4_;
    fVar184 = auVar18._24_4_;
    auVar169._0_4_ = fVar243 * fVar243 * fVar243 * auVar186._0_4_ * -0.5;
    auVar169._4_4_ = fVar309 * fVar309 * fVar309 * auVar186._4_4_ * -0.5;
    auVar169._8_4_ = fVar277 * fVar277 * fVar277 * auVar186._8_4_ * -0.5;
    auVar169._12_4_ = fVar278 * fVar278 * fVar278 * auVar186._12_4_ * -0.5;
    auVar169._16_4_ = fVar154 * fVar154 * fVar154 * -0.0;
    auVar169._20_4_ = fVar155 * fVar155 * fVar155 * -0.0;
    auVar169._24_4_ = fVar184 * fVar184 * fVar184 * -0.0;
    auVar169._28_4_ = 0;
    auVar136._8_4_ = 0x3fc00000;
    auVar136._0_8_ = 0x3fc000003fc00000;
    auVar136._12_4_ = 0x3fc00000;
    auVar136._16_4_ = 0x3fc00000;
    auVar136._20_4_ = 0x3fc00000;
    auVar136._24_4_ = 0x3fc00000;
    auVar136._28_4_ = 0x3fc00000;
    auVar6 = vfmadd231ps_fma(auVar169,auVar136,auVar18);
    fVar243 = auVar6._0_4_;
    fVar309 = auVar6._4_4_;
    auVar42._4_4_ = fVar212 * fVar309;
    auVar42._0_4_ = fVar211 * fVar243;
    fVar277 = auVar6._8_4_;
    auVar42._8_4_ = fVar213 * fVar277;
    fVar278 = auVar6._12_4_;
    auVar42._12_4_ = fVar279 * fVar278;
    auVar42._16_4_ = fVar287 * 0.0;
    auVar42._20_4_ = fVar288 * 0.0;
    auVar42._24_4_ = fVar289 * 0.0;
    auVar42._28_4_ = uVar117;
    auVar43._4_4_ = (float)local_8c0._4_4_ * fVar245 * fVar309;
    auVar43._0_4_ = (float)local_8c0._0_4_ * fVar232 * fVar243;
    auVar43._8_4_ = fStack_8b8 * fVar244 * fVar277;
    auVar43._12_4_ = fStack_8b4 * fVar246 * fVar278;
    auVar43._16_4_ = fStack_8b0 * fVar247 * 0.0;
    auVar43._20_4_ = fStack_8ac * fVar150 * 0.0;
    auVar43._24_4_ = fStack_8a8 * fVar152 * 0.0;
    auVar43._28_4_ = auVar20._28_4_;
    auVar6 = vfmadd231ps_fma(auVar43,auVar42,_local_8a0);
    auVar307 = ZEXT864(0) << 0x20;
    auVar199 = ZEXT1632(auVar129);
    auVar133 = vsubps_avx(ZEXT832(0) << 0x20,auVar199);
    auVar299 = ZEXT3264(auVar133);
    fVar213 = auVar133._0_4_;
    auVar284._0_4_ = fVar213 * fVar232 * fVar243;
    fVar279 = auVar133._4_4_;
    auVar284._4_4_ = fVar279 * fVar245 * fVar309;
    fVar287 = auVar133._8_4_;
    auVar284._8_4_ = fVar287 * fVar244 * fVar277;
    fVar288 = auVar133._12_4_;
    auVar284._12_4_ = fVar288 * fVar246 * fVar278;
    fVar289 = auVar133._16_4_;
    auVar284._16_4_ = fVar289 * fVar247 * 0.0;
    fVar290 = auVar133._20_4_;
    auVar284._20_4_ = fVar290 * fVar150 * 0.0;
    fVar291 = auVar133._24_4_;
    auVar284._24_4_ = fVar291 * fVar152 * 0.0;
    auVar284._28_4_ = 0;
    auVar301 = ZEXT1632(auVar281);
    auVar18 = vsubps_avx(ZEXT832(0) << 0x20,auVar301);
    auVar281 = vfmadd231ps_fma(auVar284,auVar18,auVar42);
    auVar44._4_4_ = fVar295 * fVar309;
    auVar44._0_4_ = fVar292 * fVar243;
    auVar44._8_4_ = fVar316 * fVar277;
    auVar44._12_4_ = fVar317 * fVar278;
    auVar44._16_4_ = fVar318 * 0.0;
    auVar44._20_4_ = fVar319 * 0.0;
    auVar44._24_4_ = fVar320 * 0.0;
    auVar44._28_4_ = uVar117;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar44,_local_860);
    auVar294 = ZEXT1664(auVar6);
    auVar260 = ZEXT832(0) << 0x20;
    auVar273 = vsubps_avx(auVar260,auVar135);
    auVar281 = vfmadd231ps_fma(ZEXT1632(auVar281),auVar273,auVar44);
    auVar286 = ZEXT1664(auVar281);
    auVar45._4_4_ = (float)local_8c0._4_4_ * fVar279;
    auVar45._0_4_ = (float)local_8c0._0_4_ * fVar213;
    auVar45._8_4_ = fStack_8b8 * fVar287;
    auVar45._12_4_ = fStack_8b4 * fVar288;
    auVar45._16_4_ = fStack_8b0 * fVar289;
    auVar45._20_4_ = fStack_8ac * fVar290;
    auVar45._24_4_ = fStack_8a8 * fVar291;
    auVar45._28_4_ = uVar117;
    auVar129 = vfmadd231ps_fma(auVar45,_local_8a0,auVar18);
    auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),_local_860,auVar273);
    fVar232 = auVar281._0_4_;
    fVar155 = auVar6._0_4_;
    fVar245 = auVar281._4_4_;
    fVar184 = auVar6._4_4_;
    fVar244 = auVar281._8_4_;
    fVar211 = auVar6._8_4_;
    fVar246 = auVar281._12_4_;
    fVar212 = auVar6._12_4_;
    auVar46._28_4_ = local_8a0._28_4_;
    auVar46._0_28_ =
         ZEXT1628(CONCAT412(fVar212 * fVar246,
                            CONCAT48(fVar211 * fVar244,CONCAT44(fVar184 * fVar245,fVar155 * fVar232)
                                    )));
    auVar21 = vsubps_avx(ZEXT1632(auVar129),auVar46);
    auVar47._4_4_ = fVar279 * fVar279;
    auVar47._0_4_ = fVar213 * fVar213;
    auVar47._8_4_ = fVar287 * fVar287;
    auVar47._12_4_ = fVar288 * fVar288;
    auVar47._16_4_ = fVar289 * fVar289;
    auVar47._20_4_ = fVar290 * fVar290;
    auVar47._24_4_ = fVar291 * fVar291;
    auVar47._28_4_ = local_8a0._28_4_;
    auVar129 = vfmadd231ps_fma(auVar47,auVar18,auVar18);
    auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar273,auVar273);
    auVar48._28_4_ = uStack_8a4;
    auVar48._0_28_ =
         ZEXT1628(CONCAT412(fVar246 * fVar246,
                            CONCAT48(fVar244 * fVar244,CONCAT44(fVar245 * fVar245,fVar232 * fVar232)
                                    )));
    auVar17 = vsubps_avx(ZEXT1632(auVar129),auVar48);
    auVar133 = vsqrtps_avx(auVar168);
    fVar154 = auVar133._28_4_ + auVar144._28_4_;
    fVar232 = (auVar133._0_4_ + auVar144._0_4_) * 1.0000002;
    fVar245 = (auVar133._4_4_ + auVar144._4_4_) * 1.0000002;
    fVar244 = (auVar133._8_4_ + auVar144._8_4_) * 1.0000002;
    fVar246 = (auVar133._12_4_ + auVar144._12_4_) * 1.0000002;
    fVar247 = (auVar133._16_4_ + auVar144._16_4_) * 1.0000002;
    fVar150 = (auVar133._20_4_ + auVar144._20_4_) * 1.0000002;
    fVar152 = (auVar133._24_4_ + auVar144._24_4_) * 1.0000002;
    auVar49._4_4_ = fVar245 * fVar245;
    auVar49._0_4_ = fVar232 * fVar232;
    auVar49._8_4_ = fVar244 * fVar244;
    auVar49._12_4_ = fVar246 * fVar246;
    auVar49._16_4_ = fVar247 * fVar247;
    auVar49._20_4_ = fVar150 * fVar150;
    auVar49._24_4_ = fVar152 * fVar152;
    auVar49._28_4_ = fVar154;
    auVar200._0_4_ = auVar21._0_4_ + auVar21._0_4_;
    auVar200._4_4_ = auVar21._4_4_ + auVar21._4_4_;
    auVar200._8_4_ = auVar21._8_4_ + auVar21._8_4_;
    auVar200._12_4_ = auVar21._12_4_ + auVar21._12_4_;
    auVar200._16_4_ = auVar21._16_4_ + auVar21._16_4_;
    auVar200._20_4_ = auVar21._20_4_ + auVar21._20_4_;
    auVar200._24_4_ = auVar21._24_4_ + auVar21._24_4_;
    fVar232 = auVar21._28_4_;
    auVar200._28_4_ = fVar232 + fVar232;
    auVar144 = vsubps_avx(auVar17,auVar49);
    auVar262 = ZEXT3264(auVar144);
    auVar266 = ZEXT1632(auVar6);
    auVar50._28_4_ = auVar17._28_4_;
    auVar50._0_28_ =
         ZEXT1628(CONCAT412(fVar212 * fVar212,
                            CONCAT48(fVar211 * fVar211,CONCAT44(fVar184 * fVar184,fVar155 * fVar155)
                                    )));
    auVar21 = vsubps_avx(local_220,auVar50);
    auVar51._4_4_ = auVar200._4_4_ * auVar200._4_4_;
    auVar51._0_4_ = auVar200._0_4_ * auVar200._0_4_;
    auVar51._8_4_ = auVar200._8_4_ * auVar200._8_4_;
    auVar51._12_4_ = auVar200._12_4_ * auVar200._12_4_;
    auVar51._16_4_ = auVar200._16_4_ * auVar200._16_4_;
    auVar51._20_4_ = auVar200._20_4_ * auVar200._20_4_;
    auVar51._24_4_ = auVar200._24_4_ * auVar200._24_4_;
    auVar51._28_4_ = fVar154;
    fVar245 = auVar21._0_4_;
    fVar244 = auVar21._4_4_;
    fVar246 = auVar21._8_4_;
    fVar247 = auVar21._12_4_;
    fVar150 = auVar21._16_4_;
    fVar152 = auVar21._20_4_;
    fVar154 = auVar21._24_4_;
    auVar52._4_4_ = fVar244 * 4.0 * auVar144._4_4_;
    auVar52._0_4_ = fVar245 * 4.0 * auVar144._0_4_;
    auVar52._8_4_ = fVar246 * 4.0 * auVar144._8_4_;
    auVar52._12_4_ = fVar247 * 4.0 * auVar144._12_4_;
    auVar52._16_4_ = fVar150 * 4.0 * auVar144._16_4_;
    auVar52._20_4_ = fVar152 * 4.0 * auVar144._20_4_;
    auVar52._24_4_ = fVar154 * 4.0 * auVar144._24_4_;
    auVar52._28_4_ = fVar232;
    auVar285 = vsubps_avx(auVar51,auVar52);
    auVar168 = vcmpps_avx(auVar285,auVar260,5);
    auVar265 = ZEXT1632(auVar281);
    fVar232 = auVar21._28_4_;
    if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar168 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar168 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar168 >> 0x7f,0) == '\0') &&
          (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar168 >> 0xbf,0) == '\0') &&
        (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar168[0x1f])
    {
      local_b40._8_4_ = 0x7f800000;
      local_b40._0_8_ = 0x7f8000007f800000;
      local_b40._12_4_ = 0x7f800000;
      local_b40._16_4_ = 0x7f800000;
      local_b40._20_4_ = 0x7f800000;
      local_b40._24_4_ = 0x7f800000;
      local_b40._28_4_ = 0x7f800000;
      auVar268._8_4_ = 0xff800000;
      auVar268._0_8_ = 0xff800000ff800000;
      auVar268._12_4_ = 0xff800000;
      auVar268._16_4_ = 0xff800000;
      auVar268._20_4_ = 0xff800000;
      auVar268._24_4_ = 0xff800000;
      auVar268._28_4_ = 0xff800000;
    }
    else {
      auVar260 = vcmpps_avx(auVar285,auVar260,5);
      auVar310 = vsqrtps_avx(auVar285);
      auVar312._0_4_ = fVar245 + fVar245;
      auVar312._4_4_ = fVar244 + fVar244;
      auVar312._8_4_ = fVar246 + fVar246;
      auVar312._12_4_ = fVar247 + fVar247;
      auVar312._16_4_ = fVar150 + fVar150;
      auVar312._20_4_ = fVar152 + fVar152;
      auVar312._24_4_ = fVar154 + fVar154;
      auVar312._28_4_ = fVar232 + fVar232;
      auVar285 = vrcpps_avx(auVar312);
      auVar137._8_4_ = 0x3f800000;
      auVar137._0_8_ = &DAT_3f8000003f800000;
      auVar137._12_4_ = 0x3f800000;
      auVar137._16_4_ = 0x3f800000;
      auVar137._20_4_ = 0x3f800000;
      auVar137._24_4_ = 0x3f800000;
      auVar137._28_4_ = 0x3f800000;
      auVar6 = vfnmadd213ps_fma(auVar312,auVar285,auVar137);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar285,auVar285);
      auVar302._0_4_ = (uint)auVar200._0_4_ ^ local_800;
      auVar302._4_4_ = (uint)auVar200._4_4_ ^ uStack_7fc;
      auVar302._8_4_ = (uint)auVar200._8_4_ ^ uStack_7f8;
      auVar302._12_4_ = (uint)auVar200._12_4_ ^ uStack_7f4;
      auVar302._16_4_ = (uint)auVar200._16_4_ ^ (uint)fStack_7f0;
      auVar302._20_4_ = (uint)auVar200._20_4_ ^ (uint)fStack_7ec;
      auVar302._24_4_ = (uint)auVar200._24_4_ ^ (uint)fStack_7e8;
      auVar302._28_4_ = (uint)auVar200._28_4_ ^ (uint)fStack_7e4;
      auVar285 = vsubps_avx(auVar302,auVar310);
      auVar53._4_4_ = auVar285._4_4_ * auVar6._4_4_;
      auVar53._0_4_ = auVar285._0_4_ * auVar6._0_4_;
      auVar53._8_4_ = auVar285._8_4_ * auVar6._8_4_;
      auVar53._12_4_ = auVar285._12_4_ * auVar6._12_4_;
      auVar53._16_4_ = auVar285._16_4_ * 0.0;
      auVar53._20_4_ = auVar285._20_4_ * 0.0;
      auVar53._24_4_ = auVar285._24_4_ * 0.0;
      auVar53._28_4_ = auVar285._28_4_;
      auVar285 = vsubps_avx(auVar310,auVar200);
      auVar54._4_4_ = auVar6._4_4_ * auVar285._4_4_;
      auVar54._0_4_ = auVar6._0_4_ * auVar285._0_4_;
      auVar54._8_4_ = auVar6._8_4_ * auVar285._8_4_;
      auVar54._12_4_ = auVar6._12_4_ * auVar285._12_4_;
      auVar54._16_4_ = auVar285._16_4_ * 0.0;
      auVar54._20_4_ = auVar285._20_4_ * 0.0;
      auVar54._24_4_ = auVar285._24_4_ * 0.0;
      auVar54._28_4_ = auVar285._28_4_;
      auVar6 = vfmadd213ps_fma(auVar266,auVar53,auVar265);
      local_640 = ZEXT1632(CONCAT412(auVar6._12_4_ * fVar278,
                                     CONCAT48(auVar6._8_4_ * fVar277,
                                              CONCAT44(auVar6._4_4_ * fVar309,auVar6._0_4_ * fVar243
                                                      ))));
      auVar6 = vfmadd213ps_fma(auVar266,auVar54,auVar265);
      local_660 = ZEXT1632(CONCAT412(auVar6._12_4_ * fVar278,
                                     CONCAT48(auVar6._8_4_ * fVar277,
                                              CONCAT44(auVar6._4_4_ * fVar309,auVar6._0_4_ * fVar243
                                                      ))));
      auVar138._8_4_ = 0x7f800000;
      auVar138._0_8_ = 0x7f8000007f800000;
      auVar138._12_4_ = 0x7f800000;
      auVar138._16_4_ = 0x7f800000;
      auVar138._20_4_ = 0x7f800000;
      auVar138._24_4_ = 0x7f800000;
      auVar138._28_4_ = 0x7f800000;
      local_b40 = vblendvps_avx(auVar138,auVar53,auVar260);
      auVar285 = vandps_avx(auVar50,local_8e0);
      auVar285 = vmaxps_avx(local_5c0,auVar285);
      auVar55._4_4_ = auVar285._4_4_ * 1.9073486e-06;
      auVar55._0_4_ = auVar285._0_4_ * 1.9073486e-06;
      auVar55._8_4_ = auVar285._8_4_ * 1.9073486e-06;
      auVar55._12_4_ = auVar285._12_4_ * 1.9073486e-06;
      auVar55._16_4_ = auVar285._16_4_ * 1.9073486e-06;
      auVar55._20_4_ = auVar285._20_4_ * 1.9073486e-06;
      auVar55._24_4_ = auVar285._24_4_ * 1.9073486e-06;
      auVar55._28_4_ = auVar285._28_4_;
      auVar307 = ZEXT3264(auVar55);
      auVar285 = vandps_avx(auVar21,local_8e0);
      auVar285 = vcmpps_avx(auVar285,auVar55,1);
      auVar139._8_4_ = 0xff800000;
      auVar139._0_8_ = 0xff800000ff800000;
      auVar139._12_4_ = 0xff800000;
      auVar139._16_4_ = 0xff800000;
      auVar139._20_4_ = 0xff800000;
      auVar139._24_4_ = 0xff800000;
      auVar139._28_4_ = 0xff800000;
      auVar268 = vblendvps_avx(auVar139,auVar54,auVar260);
      auVar310 = auVar260 & auVar285;
      if ((((((((auVar310 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar310 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar310 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar310 >> 0x7f,0) != '\0') ||
            (auVar310 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar310 >> 0xbf,0) != '\0') ||
          (auVar310 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar310[0x1f] < '\0') {
        auVar168 = vandps_avx(auVar285,auVar260);
        auVar285 = vcmpps_avx(auVar144,_DAT_02020f00,2);
        auVar262 = ZEXT3264(auVar285);
        auVar147._8_4_ = 0xff800000;
        auVar147._0_8_ = 0xff800000ff800000;
        auVar147._12_4_ = 0xff800000;
        auVar147._16_4_ = 0xff800000;
        auVar147._20_4_ = 0xff800000;
        auVar147._24_4_ = 0xff800000;
        auVar147._28_4_ = 0xff800000;
        auVar231._8_4_ = 0x7f800000;
        auVar231._0_8_ = 0x7f8000007f800000;
        auVar231._12_4_ = 0x7f800000;
        auVar231._16_4_ = 0x7f800000;
        auVar231._20_4_ = 0x7f800000;
        auVar231._24_4_ = 0x7f800000;
        auVar231._28_4_ = 0x7f800000;
        auVar144 = vblendvps_avx(auVar231,auVar147,auVar285);
        auVar6 = vpackssdw_avx(auVar168._0_16_,auVar168._16_16_);
        auVar310 = vpmovsxwd_avx2(auVar6);
        auVar307 = ZEXT3264(auVar310);
        local_b40 = vblendvps_avx(local_b40,auVar144,auVar310);
        auVar144 = vblendvps_avx(auVar147,auVar231,auVar285);
        auVar268 = vblendvps_avx(auVar268,auVar144,auVar310);
        auVar241._0_8_ = auVar168._0_8_ ^ 0xffffffffffffffff;
        auVar241._8_4_ = auVar168._8_4_ ^ 0xffffffff;
        auVar241._12_4_ = auVar168._12_4_ ^ 0xffffffff;
        auVar241._16_4_ = auVar168._16_4_ ^ 0xffffffff;
        auVar241._20_4_ = auVar168._20_4_ ^ 0xffffffff;
        auVar241._24_4_ = auVar168._24_4_ ^ 0xffffffff;
        auVar241._28_4_ = auVar168._28_4_ ^ 0xffffffff;
        auVar168 = vorps_avx(auVar285,auVar241);
        auVar168 = vandps_avx(auVar168,auVar260);
      }
    }
    auVar144 = local_240 & auVar168;
    if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar144 >> 0x7f,0) == '\0') &&
          (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar144 >> 0xbf,0) == '\0') &&
        (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar144[0x1f])
    {
LAB_01959875:
      auVar201._8_4_ = 0x3f800000;
      auVar201._0_8_ = &DAT_3f8000003f800000;
      auVar201._12_4_ = 0x3f800000;
      auVar201._16_4_ = 0x3f800000;
      auVar201._20_4_ = 0x3f800000;
      auVar201._24_4_ = 0x3f800000;
      auVar201._28_4_ = 0x3f800000;
    }
    else {
      fVar155 = *(float *)(ray + k * 4 + 0x100) - (float)local_960._0_4_;
      auVar259._4_4_ = fVar155;
      auVar259._0_4_ = fVar155;
      auVar259._8_4_ = fVar155;
      auVar259._12_4_ = fVar155;
      auVar259._16_4_ = fVar155;
      auVar259._20_4_ = fVar155;
      auVar259._24_4_ = fVar155;
      auVar259._28_4_ = fVar155;
      auVar285 = vminps_avx(auVar259,auVar268);
      auVar56._4_4_ = local_780._4_4_ * fVar279;
      auVar56._0_4_ = local_780._0_4_ * fVar213;
      auVar56._8_4_ = local_780._8_4_ * fVar287;
      auVar56._12_4_ = local_780._12_4_ * fVar288;
      auVar56._16_4_ = local_780._16_4_ * fVar289;
      auVar56._20_4_ = local_780._20_4_ * fVar290;
      auVar56._24_4_ = local_780._24_4_ * fVar291;
      auVar56._28_4_ = fVar155;
      auVar6 = vfmadd213ps_fma(auVar18,local_b00,auVar56);
      auVar281 = vfmadd213ps_fma(auVar273,local_9c0,ZEXT1632(auVar6));
      auVar57._4_4_ = local_780._4_4_ * (float)local_8c0._4_4_;
      auVar57._0_4_ = local_780._0_4_ * (float)local_8c0._0_4_;
      auVar57._8_4_ = local_780._8_4_ * fStack_8b8;
      auVar57._12_4_ = local_780._12_4_ * fStack_8b4;
      auVar57._16_4_ = local_780._16_4_ * fStack_8b0;
      auVar57._20_4_ = local_780._20_4_ * fStack_8ac;
      auVar57._24_4_ = local_780._24_4_ * fStack_8a8;
      auVar57._28_4_ = fVar155;
      auVar6 = vfmadd231ps_fma(auVar57,local_b00,_local_8a0);
      auVar129 = vfmadd231ps_fma(ZEXT1632(auVar6),_local_860,local_9c0);
      auVar144 = vandps_avx(local_8e0,ZEXT1632(auVar129));
      auVar269._8_4_ = 0x219392ef;
      auVar269._0_8_ = 0x219392ef219392ef;
      auVar269._12_4_ = 0x219392ef;
      auVar269._16_4_ = 0x219392ef;
      auVar269._20_4_ = 0x219392ef;
      auVar269._24_4_ = 0x219392ef;
      auVar269._28_4_ = 0x219392ef;
      auVar18 = vcmpps_avx(auVar144,auVar269,1);
      auVar144 = vrcpps_avx(ZEXT1632(auVar129));
      auVar313._8_4_ = 0x3f800000;
      auVar313._0_8_ = &DAT_3f8000003f800000;
      auVar313._12_4_ = 0x3f800000;
      auVar313._16_4_ = 0x3f800000;
      auVar313._20_4_ = 0x3f800000;
      auVar313._24_4_ = 0x3f800000;
      auVar313._28_4_ = 0x3f800000;
      auVar260 = ZEXT1632(auVar129);
      auVar6 = vfnmadd213ps_fma(auVar144,auVar260,auVar313);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar144,auVar144);
      auVar298._0_4_ = auVar129._0_4_ ^ local_800;
      auVar298._4_4_ = auVar129._4_4_ ^ uStack_7fc;
      auVar298._8_4_ = auVar129._8_4_ ^ uStack_7f8;
      auVar298._12_4_ = auVar129._12_4_ ^ uStack_7f4;
      auVar298._16_4_ = fStack_7f0;
      auVar298._20_4_ = fStack_7ec;
      auVar298._24_4_ = fStack_7e8;
      auVar298._28_4_ = fStack_7e4;
      auVar303._0_4_ = auVar6._0_4_ * (float)(auVar281._0_4_ ^ local_800);
      auVar303._4_4_ = auVar6._4_4_ * (float)(auVar281._4_4_ ^ uStack_7fc);
      auVar303._8_4_ = auVar6._8_4_ * (float)(auVar281._8_4_ ^ uStack_7f8);
      auVar303._12_4_ = auVar6._12_4_ * (float)(auVar281._12_4_ ^ uStack_7f4);
      auVar303._16_4_ = fStack_7f0 * 0.0;
      auVar303._20_4_ = fStack_7ec * 0.0;
      auVar303._24_4_ = fStack_7e8 * 0.0;
      auVar303._28_4_ = 0;
      auVar144 = vcmpps_avx(auVar260,auVar298,1);
      auVar144 = vorps_avx(auVar18,auVar144);
      auVar314._8_4_ = 0xff800000;
      auVar314._0_8_ = 0xff800000ff800000;
      auVar314._12_4_ = 0xff800000;
      auVar314._16_4_ = 0xff800000;
      auVar314._20_4_ = 0xff800000;
      auVar314._24_4_ = 0xff800000;
      auVar314._28_4_ = 0xff800000;
      auVar144 = vblendvps_avx(auVar303,auVar314,auVar144);
      auVar103._4_4_ = fStack_25c;
      auVar103._0_4_ = local_260;
      auVar103._8_4_ = fStack_258;
      auVar103._12_4_ = fStack_254;
      auVar103._16_4_ = fStack_250;
      auVar103._20_4_ = fStack_24c;
      auVar103._24_4_ = fStack_248;
      auVar103._28_4_ = fStack_244;
      auVar273 = vmaxps_avx(auVar103,local_b40);
      auVar273 = vmaxps_avx(auVar273,auVar144);
      auVar144 = vcmpps_avx(auVar260,auVar298,6);
      auVar144 = vorps_avx(auVar18,auVar144);
      auVar270._8_4_ = 0x7f800000;
      auVar270._0_8_ = 0x7f8000007f800000;
      auVar270._12_4_ = 0x7f800000;
      auVar270._16_4_ = 0x7f800000;
      auVar270._20_4_ = 0x7f800000;
      auVar270._24_4_ = 0x7f800000;
      auVar270._28_4_ = 0x7f800000;
      auVar144 = vblendvps_avx(auVar303,auVar270,auVar144);
      auVar285 = vminps_avx(auVar285,auVar144);
      auVar144 = vsubps_avx(ZEXT832(0) << 0x20,auVar198);
      auVar18 = vsubps_avx(ZEXT832(0) << 0x20,_local_ae0);
      auVar58._4_4_ = auVar18._4_4_ * fVar308;
      auVar58._0_4_ = auVar18._0_4_ * fVar242;
      auVar58._8_4_ = auVar18._8_4_ * fVar263;
      auVar58._12_4_ = auVar18._12_4_ * fVar300;
      auVar58._16_4_ = auVar18._16_4_ * fVar121;
      auVar58._20_4_ = auVar18._20_4_ * fVar151;
      auVar58._24_4_ = auVar18._24_4_ * fVar153;
      auVar58._28_4_ = auVar18._28_4_;
      auVar6 = vfnmsub231ps_fma(auVar58,local_9e0,auVar144);
      auVar144 = vsubps_avx(ZEXT832(0) << 0x20,auVar197);
      auVar281 = vfnmadd231ps_fma(ZEXT1632(auVar6),local_b20,auVar144);
      auVar59._4_4_ = fVar308 * (float)local_8c0._4_4_;
      auVar59._0_4_ = fVar242 * (float)local_8c0._0_4_;
      auVar59._8_4_ = fVar263 * fStack_8b8;
      auVar59._12_4_ = fVar300 * fStack_8b4;
      auVar59._16_4_ = fVar121 * fStack_8b0;
      auVar59._20_4_ = fVar151 * fStack_8ac;
      auVar59._24_4_ = fVar153 * fStack_8a8;
      auVar59._28_4_ = auVar144._28_4_;
      auVar6 = vfnmsub231ps_fma(auVar59,local_9e0,_local_8a0);
      auVar129 = vfnmadd231ps_fma(ZEXT1632(auVar6),_local_860,local_b20);
      auVar262 = ZEXT1664(auVar129);
      auVar201._8_4_ = 0x3f800000;
      auVar201._0_8_ = &DAT_3f8000003f800000;
      auVar201._12_4_ = 0x3f800000;
      auVar201._16_4_ = 0x3f800000;
      auVar201._20_4_ = 0x3f800000;
      auVar201._24_4_ = 0x3f800000;
      auVar201._28_4_ = 0x3f800000;
      auVar144 = vandps_avx(local_8e0,ZEXT1632(auVar129));
      auVar197 = vrcpps_avx(ZEXT1632(auVar129));
      auVar170._8_4_ = 0x219392ef;
      auVar170._0_8_ = 0x219392ef219392ef;
      auVar170._12_4_ = 0x219392ef;
      auVar170._16_4_ = 0x219392ef;
      auVar170._20_4_ = 0x219392ef;
      auVar170._24_4_ = 0x219392ef;
      auVar170._28_4_ = 0x219392ef;
      auVar18 = vcmpps_avx(auVar144,auVar170,1);
      auVar299 = ZEXT3264(auVar18);
      auVar198 = ZEXT1632(auVar129);
      auVar6 = vfnmadd213ps_fma(auVar197,auVar198,auVar201);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar197,auVar197);
      auVar304._0_4_ = auVar129._0_4_ ^ local_800;
      auVar304._4_4_ = auVar129._4_4_ ^ uStack_7fc;
      auVar304._8_4_ = auVar129._8_4_ ^ uStack_7f8;
      auVar304._12_4_ = auVar129._12_4_ ^ uStack_7f4;
      auVar304._16_4_ = fStack_7f0;
      auVar304._20_4_ = fStack_7ec;
      auVar304._24_4_ = fStack_7e8;
      auVar304._28_4_ = fStack_7e4;
      auVar307 = ZEXT3264(auVar304);
      auVar60._4_4_ = auVar6._4_4_ * (float)(auVar281._4_4_ ^ uStack_7fc);
      auVar60._0_4_ = auVar6._0_4_ * (float)(auVar281._0_4_ ^ local_800);
      auVar60._8_4_ = auVar6._8_4_ * (float)(auVar281._8_4_ ^ uStack_7f8);
      auVar60._12_4_ = auVar6._12_4_ * (float)(auVar281._12_4_ ^ uStack_7f4);
      auVar60._16_4_ = fStack_7f0 * 0.0;
      auVar60._20_4_ = fStack_7ec * 0.0;
      auVar60._24_4_ = fStack_7e8 * 0.0;
      auVar60._28_4_ = fStack_7e4;
      auVar144 = vcmpps_avx(auVar198,auVar304,1);
      auVar144 = vorps_avx(auVar18,auVar144);
      auVar140._8_4_ = 0xff800000;
      auVar140._0_8_ = 0xff800000ff800000;
      auVar140._12_4_ = 0xff800000;
      auVar140._16_4_ = 0xff800000;
      auVar140._20_4_ = 0xff800000;
      auVar140._24_4_ = 0xff800000;
      auVar140._28_4_ = 0xff800000;
      auVar144 = vblendvps_avx(auVar60,auVar140,auVar144);
      _local_a40 = vmaxps_avx(auVar273,auVar144);
      auVar144 = vcmpps_avx(auVar198,auVar304,6);
      auVar144 = vorps_avx(auVar18,auVar144);
      auVar171._8_4_ = 0x7f800000;
      auVar171._0_8_ = 0x7f8000007f800000;
      auVar171._12_4_ = 0x7f800000;
      auVar171._16_4_ = 0x7f800000;
      auVar171._20_4_ = 0x7f800000;
      auVar171._24_4_ = 0x7f800000;
      auVar171._28_4_ = 0x7f800000;
      auVar144 = vblendvps_avx(auVar60,auVar171,auVar144);
      auVar168 = vandps_avx(auVar168,local_240);
      local_2a0 = vminps_avx(auVar285,auVar144);
      auVar144 = vcmpps_avx(_local_a40,local_2a0,2);
      auVar18 = auVar168 & auVar144;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar18 = vminps_avx(local_640,auVar201);
        auVar74 = ZEXT812(0);
        auVar285 = ZEXT1232(auVar74) << 0x20;
        auVar18 = vmaxps_avx(auVar18,ZEXT1232(auVar74) << 0x20);
        auVar273 = vminps_avx(local_660,auVar201);
        auVar273 = vmaxps_avx(auVar273,ZEXT1232(auVar74) << 0x20);
        auVar62._4_4_ = (auVar18._4_4_ + 1.0) * 0.125;
        auVar62._0_4_ = (auVar18._0_4_ + 0.0) * 0.125;
        auVar62._8_4_ = (auVar18._8_4_ + 2.0) * 0.125;
        auVar62._12_4_ = (auVar18._12_4_ + 3.0) * 0.125;
        auVar62._16_4_ = (auVar18._16_4_ + 4.0) * 0.125;
        auVar62._20_4_ = (auVar18._20_4_ + 5.0) * 0.125;
        auVar62._24_4_ = (auVar18._24_4_ + 6.0) * 0.125;
        auVar62._28_4_ = auVar18._28_4_ + 7.0;
        auVar307 = ZEXT3264(local_aa0);
        auVar6 = vfmadd213ps_fma(auVar62,local_aa0,local_a00);
        auVar63._4_4_ = (auVar273._4_4_ + 1.0) * 0.125;
        auVar63._0_4_ = (auVar273._0_4_ + 0.0) * 0.125;
        auVar63._8_4_ = (auVar273._8_4_ + 2.0) * 0.125;
        auVar63._12_4_ = (auVar273._12_4_ + 3.0) * 0.125;
        auVar63._16_4_ = (auVar273._16_4_ + 4.0) * 0.125;
        auVar63._20_4_ = (auVar273._20_4_ + 5.0) * 0.125;
        auVar63._24_4_ = (auVar273._24_4_ + 6.0) * 0.125;
        auVar63._28_4_ = auVar273._28_4_ + 7.0;
        auVar281 = vfmadd213ps_fma(auVar63,local_aa0,local_a00);
        auVar18 = vminps_avx(local_a20,local_7a0);
        auVar273 = vminps_avx(local_7c0,local_7e0);
        auVar18 = vminps_avx(auVar18,auVar273);
        auVar133 = vsubps_avx(auVar18,auVar133);
        auVar168 = vandps_avx(auVar144,auVar168);
        local_640 = ZEXT1632(auVar6);
        local_660 = ZEXT1632(auVar281);
        auVar64._4_4_ = auVar133._4_4_ * 0.99999976;
        auVar64._0_4_ = auVar133._0_4_ * 0.99999976;
        auVar64._8_4_ = auVar133._8_4_ * 0.99999976;
        auVar64._12_4_ = auVar133._12_4_ * 0.99999976;
        auVar64._16_4_ = auVar133._16_4_ * 0.99999976;
        auVar64._20_4_ = auVar133._20_4_ * 0.99999976;
        auVar64._24_4_ = auVar133._24_4_ * 0.99999976;
        auVar64._28_4_ = auVar133._28_4_;
        auVar133 = vmaxps_avx(ZEXT832(0) << 0x20,auVar64);
        auVar65._4_4_ = auVar133._4_4_ * auVar133._4_4_;
        auVar65._0_4_ = auVar133._0_4_ * auVar133._0_4_;
        auVar65._8_4_ = auVar133._8_4_ * auVar133._8_4_;
        auVar65._12_4_ = auVar133._12_4_ * auVar133._12_4_;
        auVar65._16_4_ = auVar133._16_4_ * auVar133._16_4_;
        auVar65._20_4_ = auVar133._20_4_ * auVar133._20_4_;
        auVar65._24_4_ = auVar133._24_4_ * auVar133._24_4_;
        auVar65._28_4_ = auVar133._28_4_;
        auVar144 = vsubps_avx(auVar17,auVar65);
        auVar66._4_4_ = auVar144._4_4_ * fVar244 * 4.0;
        auVar66._0_4_ = auVar144._0_4_ * fVar245 * 4.0;
        auVar66._8_4_ = auVar144._8_4_ * fVar246 * 4.0;
        auVar66._12_4_ = auVar144._12_4_ * fVar247 * 4.0;
        auVar66._16_4_ = auVar144._16_4_ * fVar150 * 4.0;
        auVar66._20_4_ = auVar144._20_4_ * fVar152 * 4.0;
        auVar66._24_4_ = auVar144._24_4_ * fVar154 * 4.0;
        auVar66._28_4_ = auVar133._28_4_;
        auVar18 = vsubps_avx(auVar51,auVar66);
        auVar299 = ZEXT3264(auVar18);
        auVar133 = vcmpps_avx(auVar18,ZEXT1232(auVar74) << 0x20,5);
        if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar133 >> 0x7f,0) == '\0') &&
              (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar133 >> 0xbf,0) == '\0') &&
            (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar133[0x1f]) {
          auVar143 = SUB6432(ZEXT864(0),0) << 0x20;
          local_920 = ZEXT832(0) << 0x20;
          _local_760 = ZEXT832(0) << 0x20;
          auVar209 = ZEXT864(0) << 0x20;
          auVar261._8_4_ = 0x7f800000;
          auVar261._0_8_ = 0x7f8000007f800000;
          auVar261._12_4_ = 0x7f800000;
          auVar261._16_4_ = 0x7f800000;
          auVar261._20_4_ = 0x7f800000;
          auVar261._24_4_ = 0x7f800000;
          auVar261._28_4_ = 0x7f800000;
          auVar271._8_4_ = 0xff800000;
          auVar271._0_8_ = 0xff800000ff800000;
          auVar271._12_4_ = 0xff800000;
          auVar271._16_4_ = 0xff800000;
          auVar271._20_4_ = 0xff800000;
          auVar271._24_4_ = 0xff800000;
          auVar271._28_4_ = 0xff800000;
          local_900 = local_920;
        }
        else {
          auVar285 = vsqrtps_avx(auVar18);
          auVar272._0_4_ = fVar245 + fVar245;
          auVar272._4_4_ = fVar244 + fVar244;
          auVar272._8_4_ = fVar246 + fVar246;
          auVar272._12_4_ = fVar247 + fVar247;
          auVar272._16_4_ = fVar150 + fVar150;
          auVar272._20_4_ = fVar152 + fVar152;
          auVar272._24_4_ = fVar154 + fVar154;
          auVar272._28_4_ = fVar232 + fVar232;
          auVar273 = vrcpps_avx(auVar272);
          auVar6 = vfnmadd213ps_fma(auVar272,auVar273,auVar201);
          auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar273,auVar273);
          auVar305._0_4_ = (uint)auVar200._0_4_ ^ local_800;
          auVar305._4_4_ = (uint)auVar200._4_4_ ^ uStack_7fc;
          auVar305._8_4_ = (uint)auVar200._8_4_ ^ uStack_7f8;
          auVar305._12_4_ = (uint)auVar200._12_4_ ^ uStack_7f4;
          auVar305._16_4_ = (uint)auVar200._16_4_ ^ (uint)fStack_7f0;
          auVar305._20_4_ = (uint)auVar200._20_4_ ^ (uint)fStack_7ec;
          auVar305._24_4_ = (uint)auVar200._24_4_ ^ (uint)fStack_7e8;
          auVar305._28_4_ = (uint)auVar200._28_4_ ^ (uint)fStack_7e4;
          auVar273 = vsubps_avx(auVar305,auVar285);
          auVar197 = vsubps_avx(auVar285,auVar200);
          fVar232 = auVar273._0_4_ * auVar6._0_4_;
          fVar242 = auVar273._4_4_ * auVar6._4_4_;
          auVar67._4_4_ = fVar242;
          auVar67._0_4_ = fVar232;
          fVar245 = auVar273._8_4_ * auVar6._8_4_;
          auVar67._8_4_ = fVar245;
          fVar308 = auVar273._12_4_ * auVar6._12_4_;
          auVar67._12_4_ = fVar308;
          fVar244 = auVar273._16_4_ * 0.0;
          auVar67._16_4_ = fVar244;
          fVar263 = auVar273._20_4_ * 0.0;
          auVar67._20_4_ = fVar263;
          fVar246 = auVar273._24_4_ * 0.0;
          auVar67._24_4_ = fVar246;
          auVar67._28_4_ = auVar285._28_4_;
          fVar300 = auVar197._0_4_ * auVar6._0_4_;
          fVar247 = auVar197._4_4_ * auVar6._4_4_;
          auVar68._4_4_ = fVar247;
          auVar68._0_4_ = fVar300;
          fVar121 = auVar197._8_4_ * auVar6._8_4_;
          auVar68._8_4_ = fVar121;
          fVar150 = auVar197._12_4_ * auVar6._12_4_;
          auVar68._12_4_ = fVar150;
          fVar151 = auVar197._16_4_ * 0.0;
          auVar68._16_4_ = fVar151;
          fVar152 = auVar197._20_4_ * 0.0;
          auVar68._20_4_ = fVar152;
          fVar153 = auVar197._24_4_ * 0.0;
          auVar68._24_4_ = fVar153;
          auVar68._28_4_ = auVar273._28_4_;
          auVar307 = ZEXT3264(auVar68);
          auVar6 = vfmadd213ps_fma(auVar266,auVar67,auVar265);
          auVar281 = vfmadd213ps_fma(auVar266,auVar68,auVar265);
          auVar273 = ZEXT1632(CONCAT412(fVar278 * auVar6._12_4_,
                                        CONCAT48(fVar277 * auVar6._8_4_,
                                                 CONCAT44(fVar309 * auVar6._4_4_,
                                                          fVar243 * auVar6._0_4_))));
          auVar285 = ZEXT1632(CONCAT412(fVar278 * auVar281._12_4_,
                                        CONCAT48(fVar277 * auVar281._8_4_,
                                                 CONCAT44(fVar309 * auVar281._4_4_,
                                                          fVar243 * auVar281._0_4_))));
          auVar6 = vfmadd213ps_fma(auVar19,auVar273,auVar135);
          auVar281 = vfmadd213ps_fma(auVar19,auVar285,auVar135);
          auVar129 = vfmadd213ps_fma(auVar20,auVar273,auVar301);
          auVar122 = vfmadd213ps_fma(auVar20,auVar285,auVar301);
          auVar186 = vfmadd213ps_fma(auVar273,auVar143,auVar199);
          auVar123 = vfmadd213ps_fma(auVar143,auVar285,auVar199);
          auVar69._4_4_ = (float)local_860._4_4_ * fVar242;
          auVar69._0_4_ = (float)local_860._0_4_ * fVar232;
          auVar69._8_4_ = fStack_858 * fVar245;
          auVar69._12_4_ = fStack_854 * fVar308;
          auVar69._16_4_ = fStack_850 * fVar244;
          auVar69._20_4_ = fStack_84c * fVar263;
          auVar69._24_4_ = fStack_848 * fVar246;
          auVar69._28_4_ = 0;
          auVar143 = vsubps_avx(auVar69,ZEXT1632(auVar6));
          auVar173._0_4_ = (float)local_8a0._0_4_ * fVar232;
          auVar173._4_4_ = (float)local_8a0._4_4_ * fVar242;
          auVar173._8_4_ = fStack_898 * fVar245;
          auVar173._12_4_ = fStack_894 * fVar308;
          auVar173._16_4_ = fStack_890 * fVar244;
          auVar173._20_4_ = fStack_88c * fVar263;
          auVar173._24_4_ = fStack_888 * fVar246;
          auVar173._28_4_ = 0;
          auVar285 = vsubps_avx(auVar173,ZEXT1632(auVar129));
          auVar203._0_4_ = (float)local_8c0._0_4_ * fVar232;
          auVar203._4_4_ = (float)local_8c0._4_4_ * fVar242;
          auVar203._8_4_ = fStack_8b8 * fVar245;
          auVar203._12_4_ = fStack_8b4 * fVar308;
          auVar203._16_4_ = fStack_8b0 * fVar244;
          auVar203._20_4_ = fStack_8ac * fVar263;
          auVar203._24_4_ = fStack_8a8 * fVar246;
          auVar203._28_4_ = 0;
          auVar19 = vsubps_avx(auVar203,ZEXT1632(auVar186));
          auVar209 = ZEXT3264(auVar19);
          auVar274._0_4_ = (float)local_860._0_4_ * fVar300;
          auVar274._4_4_ = (float)local_860._4_4_ * fVar247;
          auVar274._8_4_ = fStack_858 * fVar121;
          auVar274._12_4_ = fStack_854 * fVar150;
          auVar274._16_4_ = fStack_850 * fVar151;
          auVar274._20_4_ = fStack_84c * fVar152;
          auVar274._24_4_ = fStack_848 * fVar153;
          auVar274._28_4_ = 0;
          local_900 = vsubps_avx(auVar274,ZEXT1632(auVar281));
          auVar70._4_4_ = (float)local_8a0._4_4_ * fVar247;
          auVar70._0_4_ = (float)local_8a0._0_4_ * fVar300;
          auVar70._8_4_ = fStack_898 * fVar121;
          auVar70._12_4_ = fStack_894 * fVar150;
          auVar70._16_4_ = fStack_890 * fVar151;
          auVar70._20_4_ = fStack_88c * fVar152;
          auVar70._24_4_ = fStack_888 * fVar153;
          auVar70._28_4_ = local_900._28_4_;
          local_920 = vsubps_avx(auVar70,ZEXT1632(auVar122));
          auVar71._4_4_ = (float)local_8c0._4_4_ * fVar247;
          auVar71._0_4_ = (float)local_8c0._0_4_ * fVar300;
          auVar71._8_4_ = fStack_8b8 * fVar121;
          auVar71._12_4_ = fStack_8b4 * fVar150;
          auVar71._16_4_ = fStack_8b0 * fVar151;
          auVar71._20_4_ = fStack_8ac * fVar152;
          auVar71._24_4_ = fStack_8a8 * fVar153;
          auVar71._28_4_ = local_920._28_4_;
          _local_760 = vsubps_avx(auVar71,ZEXT1632(auVar123));
          auVar19 = vcmpps_avx(auVar18,_DAT_02020f00,5);
          auVar275._8_4_ = 0x7f800000;
          auVar275._0_8_ = 0x7f8000007f800000;
          auVar275._12_4_ = 0x7f800000;
          auVar275._16_4_ = 0x7f800000;
          auVar275._20_4_ = 0x7f800000;
          auVar275._24_4_ = 0x7f800000;
          auVar275._28_4_ = 0x7f800000;
          auVar261 = vblendvps_avx(auVar275,auVar67,auVar19);
          auVar18 = vandps_avx(local_8e0,auVar50);
          auVar18 = vmaxps_avx(local_5c0,auVar18);
          auVar299 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar72._4_4_ = auVar18._4_4_ * 1.9073486e-06;
          auVar72._0_4_ = auVar18._0_4_ * 1.9073486e-06;
          auVar72._8_4_ = auVar18._8_4_ * 1.9073486e-06;
          auVar72._12_4_ = auVar18._12_4_ * 1.9073486e-06;
          auVar72._16_4_ = auVar18._16_4_ * 1.9073486e-06;
          auVar72._20_4_ = auVar18._20_4_ * 1.9073486e-06;
          auVar72._24_4_ = auVar18._24_4_ * 1.9073486e-06;
          auVar72._28_4_ = auVar18._28_4_;
          auVar18 = vandps_avx(local_8e0,auVar21);
          auVar18 = vcmpps_avx(auVar18,auVar72,1);
          auVar294 = ZEXT3264(auVar18);
          auVar276._8_4_ = 0xff800000;
          auVar276._0_8_ = 0xff800000ff800000;
          auVar276._12_4_ = 0xff800000;
          auVar276._16_4_ = 0xff800000;
          auVar276._20_4_ = 0xff800000;
          auVar276._24_4_ = 0xff800000;
          auVar276._28_4_ = 0xff800000;
          auVar271 = vblendvps_avx(auVar276,auVar68,auVar19);
          auVar20 = auVar19 & auVar18;
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0x7f,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0xbf,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar20[0x1f] < '\0') {
            auVar133 = vandps_avx(auVar18,auVar19);
            auVar18 = vcmpps_avx(auVar144,ZEXT832(0) << 0x20,2);
            auVar306._8_4_ = 0xff800000;
            auVar306._0_8_ = 0xff800000ff800000;
            auVar306._12_4_ = 0xff800000;
            auVar306._16_4_ = 0xff800000;
            auVar306._20_4_ = 0xff800000;
            auVar306._24_4_ = 0xff800000;
            auVar306._28_4_ = 0xff800000;
            auVar307 = ZEXT3264(auVar306);
            auVar315._8_4_ = 0x7f800000;
            auVar315._0_8_ = 0x7f8000007f800000;
            auVar315._12_4_ = 0x7f800000;
            auVar315._16_4_ = 0x7f800000;
            auVar315._20_4_ = 0x7f800000;
            auVar315._24_4_ = 0x7f800000;
            auVar315._28_4_ = 0x7f800000;
            auVar144 = vblendvps_avx(auVar315,auVar306,auVar18);
            auVar6 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
            auVar20 = vpmovsxwd_avx2(auVar6);
            auVar294 = ZEXT3264(auVar20);
            auVar261 = vblendvps_avx(auVar261,auVar144,auVar20);
            auVar144 = vblendvps_avx(auVar306,auVar315,auVar18);
            auVar299 = ZEXT3264(auVar144);
            auVar271 = vblendvps_avx(auVar271,auVar144,auVar20);
            auVar253._0_8_ = auVar133._0_8_ ^ 0xffffffffffffffff;
            auVar253._8_4_ = auVar133._8_4_ ^ 0xffffffff;
            auVar253._12_4_ = auVar133._12_4_ ^ 0xffffffff;
            auVar253._16_4_ = auVar133._16_4_ ^ 0xffffffff;
            auVar253._20_4_ = auVar133._20_4_ ^ 0xffffffff;
            auVar253._24_4_ = auVar133._24_4_ ^ 0xffffffff;
            auVar253._28_4_ = auVar133._28_4_ ^ 0xffffffff;
            auVar133 = vorps_avx(auVar18,auVar253);
            auVar133 = vandps_avx(auVar19,auVar133);
          }
        }
        auVar286 = ZEXT3264(_local_a40);
        local_420 = _local_a40;
        local_400 = vminps_avx(local_2a0,auVar261);
        auVar18 = vmaxps_avx(_local_a40,auVar271);
        _local_2c0 = auVar18;
        auVar144 = vcmpps_avx(_local_a40,local_400,2);
        local_680 = vandps_avx(auVar144,auVar168);
        auVar144 = vcmpps_avx(auVar18,local_2a0,2);
        local_720 = vandps_avx(auVar144,auVar168);
        auVar262 = ZEXT3264(local_720);
        auVar168 = vorps_avx(local_720,local_680);
        if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar168 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar168 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar168 >> 0x7f,0) != '\0') ||
              (auVar168 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar168 >> 0xbf,0) != '\0') ||
            (auVar168 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar168[0x1f] < '\0') {
          local_940._0_8_ = auVar133._0_8_ ^ 0xffffffffffffffff;
          local_940._8_4_ = auVar133._8_4_ ^ 0xffffffff;
          local_940._12_4_ = auVar133._12_4_ ^ 0xffffffff;
          local_940._16_4_ = auVar133._16_4_ ^ 0xffffffff;
          local_940._20_4_ = auVar133._20_4_ ^ 0xffffffff;
          local_940._24_4_ = auVar133._24_4_ ^ 0xffffffff;
          local_940._28_4_ = auVar133._28_4_ ^ 0xffffffff;
          auVar210._0_4_ = auVar209._0_4_ * (float)local_8c0._0_4_;
          auVar210._4_4_ = auVar209._4_4_ * (float)local_8c0._4_4_;
          auVar210._8_4_ = auVar209._8_4_ * fStack_8b8;
          auVar210._12_4_ = auVar209._12_4_ * fStack_8b4;
          auVar210._16_4_ = auVar209._16_4_ * fStack_8b0;
          auVar210._20_4_ = auVar209._20_4_ * fStack_8ac;
          auVar210._28_36_ = auVar209._28_36_;
          auVar210._24_4_ = auVar209._24_4_ * fStack_8a8;
          auVar6 = vfmadd132ps_fma(auVar285,auVar210._0_32_,_local_8a0);
          auVar6 = vfmadd132ps_fma(auVar143,ZEXT1632(auVar6),_local_860);
          auVar168 = vandps_avx(ZEXT1632(auVar6),local_8e0);
          auVar174._8_4_ = 0x3e99999a;
          auVar174._0_8_ = 0x3e99999a3e99999a;
          auVar174._12_4_ = 0x3e99999a;
          auVar174._16_4_ = 0x3e99999a;
          auVar174._20_4_ = 0x3e99999a;
          auVar174._24_4_ = 0x3e99999a;
          auVar174._28_4_ = 0x3e99999a;
          auVar168 = vcmpps_avx(auVar168,auVar174,1);
          auVar168 = vorps_avx(auVar168,local_940);
          auVar175._8_4_ = 3;
          auVar175._0_8_ = 0x300000003;
          auVar175._12_4_ = 3;
          auVar175._16_4_ = 3;
          auVar175._20_4_ = 3;
          auVar175._24_4_ = 3;
          auVar175._28_4_ = 3;
          auVar204._8_4_ = 2;
          auVar204._0_8_ = 0x200000002;
          auVar204._12_4_ = 2;
          auVar204._16_4_ = 2;
          auVar204._20_4_ = 2;
          auVar204._24_4_ = 2;
          auVar204._28_4_ = 2;
          auVar168 = vblendvps_avx(auVar204,auVar175,auVar168);
          uVar117 = (undefined4)uVar118;
          local_6e0._4_4_ = uVar117;
          local_6e0._0_4_ = uVar117;
          local_6e0._8_4_ = uVar117;
          local_6e0._12_4_ = uVar117;
          local_6e0._16_4_ = uVar117;
          local_6e0._20_4_ = uVar117;
          local_6e0._24_4_ = uVar117;
          local_6e0._28_4_ = uVar117;
          local_6a0 = vpcmpgtd_avx2(auVar168,local_6e0);
          auVar168 = vpandn_avx2(local_6a0,local_680);
          auVar133 = local_680 & ~local_6a0;
          auStack_738 = auVar51._8_24_;
          local_740 = uVar118;
          fStack_bac = auVar5._4_4_;
          fStack_ba8 = auVar5._8_4_;
          fStack_ba4 = auVar5._12_4_;
          local_700 = auVar168;
          local_6c0 = local_720;
          if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar133 >> 0x7f,0) != '\0') ||
                (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar133 >> 0xbf,0) != '\0') ||
              (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar133[0x1f] < '\0') {
            auVar281 = vminps_avx(auVar2,auVar4);
            auVar6 = vmaxps_avx(auVar2,auVar4);
            auVar129 = vminps_avx(auVar3,auVar5);
            auVar122 = vminps_avx(auVar281,auVar129);
            auVar281 = vmaxps_avx(auVar3,auVar5);
            auVar129 = vmaxps_avx(auVar6,auVar281);
            auVar214._8_4_ = 0x7fffffff;
            auVar214._0_8_ = 0x7fffffff7fffffff;
            auVar214._12_4_ = 0x7fffffff;
            local_a00._0_16_ = auVar214;
            auVar6 = vandps_avx(auVar122,auVar214);
            auVar281 = vandps_avx(auVar129,auVar214);
            auVar6 = vmaxps_avx(auVar6,auVar281);
            auVar281 = vmovshdup_avx(auVar6);
            auVar281 = vmaxss_avx(auVar281,auVar6);
            auVar6 = vshufpd_avx(auVar6,auVar6,1);
            auVar6 = vmaxss_avx(auVar6,auVar281);
            local_9c0._4_24_ = auVar283._4_24_;
            local_9c0._0_4_ = auVar6._0_4_ * 1.9073486e-06;
            local_9c0._28_4_ = 0;
            local_840._0_16_ = vshufps_avx(auVar129,auVar129,0xff);
            local_840._16_16_ = auVar17._16_16_;
            local_880._4_4_ = (float)local_a40._4_4_ + (float)local_820._4_4_;
            local_880._0_4_ = (float)local_a40._0_4_ + (float)local_820._0_4_;
            fStack_878 = fStack_a38 + fStack_818;
            fStack_874 = fStack_a34 + fStack_814;
            fStack_870 = fStack_a30 + fStack_810;
            fStack_86c = fStack_a2c + fStack_80c;
            fStack_868 = fStack_a28 + fStack_808;
            fStack_864 = fStack_a24 + fStack_804;
            do {
              auVar176._8_4_ = 0x7f800000;
              auVar176._0_8_ = 0x7f8000007f800000;
              auVar176._12_4_ = 0x7f800000;
              auVar176._16_4_ = 0x7f800000;
              auVar176._20_4_ = 0x7f800000;
              auVar176._24_4_ = 0x7f800000;
              auVar176._28_4_ = 0x7f800000;
              auVar133 = vblendvps_avx(auVar176,_local_a40,auVar168);
              auVar144 = vshufps_avx(auVar133,auVar133,0xb1);
              auVar144 = vminps_avx(auVar133,auVar144);
              auVar19 = vshufpd_avx(auVar144,auVar144,5);
              auVar144 = vminps_avx(auVar144,auVar19);
              auVar19 = vpermpd_avx2(auVar144,0x4e);
              auVar144 = vminps_avx(auVar144,auVar19);
              auVar144 = vcmpps_avx(auVar133,auVar144,0);
              auVar19 = auVar168 & auVar144;
              auVar133 = auVar168;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                auVar133 = vandps_avx(auVar144,auVar168);
              }
              uVar115 = vmovmskps_avx(auVar133);
              iVar109 = 0;
              for (; (uVar115 & 1) == 0; uVar115 = uVar115 >> 1 | 0x80000000) {
                iVar109 = iVar109 + 1;
              }
              uVar110 = iVar109 << 2;
              local_700 = auVar168;
              *(undefined4 *)(local_700 + uVar110) = 0;
              uVar115 = *(uint *)(local_640 + uVar110);
              uVar110 = *(uint *)(local_420 + uVar110);
              fVar232 = auVar15._0_4_;
              if ((float)local_a60._0_4_ < 0.0) {
                fVar232 = sqrtf((float)local_a60._0_4_);
              }
              auVar294 = ZEXT464(uVar110);
              auVar286 = ZEXT464(uVar115);
              local_b40._0_4_ = fVar232 * 1.9073486e-06;
              lVar113 = 4;
              do {
                fVar244 = auVar286._0_4_;
                fVar309 = 1.0 - fVar244;
                local_b00._0_16_ = ZEXT416((uint)fVar309);
                fVar245 = fVar309 * fVar309 * fVar309;
                fVar308 = fVar244 * fVar244;
                fVar243 = fVar244 * fVar308;
                auVar281 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar245),
                                           ZEXT416((uint)fVar243));
                fVar242 = fVar244 * fVar309;
                auVar129 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * fVar242 * 6.0)),
                                           ZEXT416((uint)(fVar309 * fVar242)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar122 = vfmadd231ss_fma(ZEXT416((uint)(fVar309 * fVar242 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar244 * fVar242)));
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar243),
                                         ZEXT416((uint)fVar245));
                fVar232 = (auVar6._0_4_ + auVar122._0_4_) * 0.16666667;
                fVar243 = fVar243 * 0.16666667;
                auVar156._0_4_ = fVar243 * fVar149;
                auVar156._4_4_ = fVar243 * fStack_bac;
                auVar156._8_4_ = fVar243 * fStack_ba8;
                auVar156._12_4_ = fVar243 * fStack_ba4;
                auVar215._4_4_ = fVar232;
                auVar215._0_4_ = fVar232;
                auVar215._8_4_ = fVar232;
                auVar215._12_4_ = fVar232;
                auVar6 = vfmadd132ps_fma(auVar215,auVar156,auVar3);
                fVar232 = (auVar281._0_4_ + auVar129._0_4_) * 0.16666667;
                auVar157._4_4_ = fVar232;
                auVar157._0_4_ = fVar232;
                auVar157._8_4_ = fVar232;
                auVar157._12_4_ = fVar232;
                auVar6 = vfmadd132ps_fma(auVar157,auVar6,auVar4);
                fVar232 = auVar294._0_4_;
                auVar188._4_4_ = fVar232;
                auVar188._0_4_ = fVar232;
                auVar188._8_4_ = fVar232;
                auVar188._12_4_ = fVar232;
                auVar281 = vfmadd213ps_fma(auVar188,local_a50,_DAT_01feba10);
                fVar245 = fVar245 * 0.16666667;
                auVar124._4_4_ = fVar245;
                auVar124._0_4_ = fVar245;
                auVar124._8_4_ = fVar245;
                auVar124._12_4_ = fVar245;
                auVar6 = vfmadd132ps_fma(auVar124,auVar6,auVar2);
                local_780._0_16_ = auVar6;
                auVar6 = vsubps_avx(auVar281,auVar6);
                _local_ae0 = auVar6;
                auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
                fVar243 = auVar6._0_4_;
                auVar281 = auVar286._0_16_;
                if (fVar243 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)fVar309);
                  local_b20._0_4_ = fVar308;
                  local_a80._0_4_ = fVar242;
                  auVar294._0_4_ = sqrtf(fVar243);
                  auVar294._4_60_ = extraout_var;
                  auVar129 = auVar294._0_16_;
                  fVar242 = (float)local_a80._0_4_;
                  fVar308 = (float)local_b20._0_4_;
                }
                else {
                  auVar129 = vsqrtss_avx(auVar6,auVar6);
                }
                fVar245 = local_b00._0_4_;
                auVar125._4_4_ = fVar245;
                auVar125._0_4_ = fVar245;
                auVar125._8_4_ = fVar245;
                auVar125._12_4_ = fVar245;
                auVar186 = vfnmsub213ss_fma(auVar281,auVar281,ZEXT416((uint)(fVar242 * 4.0)));
                auVar122 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * 4.0)),local_b00._0_16_,
                                           local_b00._0_16_);
                fVar242 = fVar245 * -fVar245 * 0.5;
                fVar245 = auVar186._0_4_ * 0.5;
                fVar309 = auVar122._0_4_ * 0.5;
                fVar308 = fVar308 * 0.5;
                auVar249._0_4_ = fVar149 * fVar308;
                auVar249._4_4_ = fStack_bac * fVar308;
                auVar249._8_4_ = fStack_ba8 * fVar308;
                auVar249._12_4_ = fStack_ba4 * fVar308;
                auVar216._4_4_ = fVar309;
                auVar216._0_4_ = fVar309;
                auVar216._8_4_ = fVar309;
                auVar216._12_4_ = fVar309;
                auVar122 = vfmadd213ps_fma(auVar216,auVar3,auVar249);
                auVar233._4_4_ = fVar245;
                auVar233._0_4_ = fVar245;
                auVar233._8_4_ = fVar245;
                auVar233._12_4_ = fVar245;
                auVar122 = vfmadd213ps_fma(auVar233,auVar4,auVar122);
                auVar296._4_4_ = fVar242;
                auVar296._0_4_ = fVar242;
                auVar296._8_4_ = fVar242;
                auVar296._12_4_ = fVar242;
                auVar123 = vfmadd213ps_fma(auVar296,auVar2,auVar122);
                auVar122 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_b00._0_16_,auVar281)
                ;
                auVar281 = vfmadd231ss_fma(local_b00._0_16_,auVar281,SUB6416(ZEXT464(0xc0000000),0))
                ;
                auVar217._0_4_ = fVar149 * fVar244;
                auVar217._4_4_ = fStack_bac * fVar244;
                auVar217._8_4_ = fStack_ba8 * fVar244;
                auVar217._12_4_ = fStack_ba4 * fVar244;
                uVar117 = auVar281._0_4_;
                auVar234._4_4_ = uVar117;
                auVar234._0_4_ = uVar117;
                auVar234._8_4_ = uVar117;
                auVar234._12_4_ = uVar117;
                auVar281 = vfmadd213ps_fma(auVar234,auVar3,auVar217);
                auVar189._0_4_ = auVar122._0_4_;
                auVar189._4_4_ = auVar189._0_4_;
                auVar189._8_4_ = auVar189._0_4_;
                auVar189._12_4_ = auVar189._0_4_;
                auVar281 = vfmadd213ps_fma(auVar189,auVar4,auVar281);
                auVar164 = vfmadd231ps_fma(auVar281,auVar2,auVar125);
                auVar122 = vdpps_avx(auVar123,auVar123,0x7f);
                auVar281 = vblendps_avx(auVar122,_DAT_01feba10,0xe);
                auVar186 = vrsqrtss_avx(auVar281,auVar281);
                fVar242 = auVar186._0_4_;
                fVar308 = auVar122._0_4_;
                fVar242 = fVar242 * 1.5 + fVar308 * -0.5 * fVar242 * fVar242 * fVar242;
                auVar186 = vdpps_avx(auVar123,auVar164,0x7f);
                auVar190._0_4_ = auVar164._0_4_ * fVar308;
                auVar190._4_4_ = auVar164._4_4_ * fVar308;
                auVar190._8_4_ = auVar164._8_4_ * fVar308;
                auVar190._12_4_ = auVar164._12_4_ * fVar308;
                fVar245 = auVar186._0_4_;
                auVar250._0_4_ = auVar123._0_4_ * fVar245;
                auVar250._4_4_ = auVar123._4_4_ * fVar245;
                fVar309 = auVar123._8_4_;
                auVar250._8_4_ = fVar309 * fVar245;
                fVar263 = auVar123._12_4_;
                auVar250._12_4_ = fVar263 * fVar245;
                auVar186 = vsubps_avx(auVar190,auVar250);
                auVar281 = vrcpss_avx(auVar281,auVar281);
                auVar164 = vfnmadd213ss_fma(auVar281,auVar122,ZEXT416(0x40000000));
                fVar245 = auVar281._0_4_ * auVar164._0_4_;
                auVar281 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                      ZEXT416((uint)(fVar232 * (float)local_b40._0_4_)));
                local_9e0._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
                local_9e0._8_4_ = -fVar309;
                local_9e0._12_4_ = -fVar263;
                auVar218._0_4_ = fVar242 * auVar186._0_4_ * fVar245;
                auVar218._4_4_ = fVar242 * auVar186._4_4_ * fVar245;
                auVar218._8_4_ = fVar242 * auVar186._8_4_ * fVar245;
                auVar218._12_4_ = fVar242 * auVar186._12_4_ * fVar245;
                auVar257._0_4_ = auVar123._0_4_ * fVar242;
                auVar257._4_4_ = auVar123._4_4_ * fVar242;
                auVar257._8_4_ = fVar309 * fVar242;
                auVar257._12_4_ = fVar263 * fVar242;
                local_b00._0_16_ = auVar123;
                local_b20._0_4_ = auVar281._0_4_;
                if (fVar308 < -fVar308) {
                  local_a80._0_4_ = auVar129._0_4_;
                  local_aa0._0_16_ = auVar257;
                  local_a20._0_16_ = auVar218;
                  fVar242 = sqrtf(fVar308);
                  auVar281 = ZEXT416((uint)local_b20._0_4_);
                  auVar129 = ZEXT416((uint)local_a80._0_4_);
                  auVar218 = local_a20._0_16_;
                  auVar257 = local_aa0._0_16_;
                }
                else {
                  auVar122 = vsqrtss_avx(auVar122,auVar122);
                  fVar242 = auVar122._0_4_;
                }
                auVar122 = vdpps_avx(_local_ae0,auVar257,0x7f);
                auVar164 = vfmadd213ss_fma(ZEXT416((uint)local_9c0._0_4_),auVar129,auVar281);
                auVar186 = vdpps_avx(local_9e0._0_16_,auVar257,0x7f);
                auVar123 = vdpps_avx(_local_ae0,auVar218,0x7f);
                local_a80._0_16_ = vdpps_avx(local_a50,auVar257,0x7f);
                auVar164 = vfmadd213ss_fma(ZEXT416((uint)(auVar129._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_9c0._0_4_ / fVar242)),
                                           auVar164);
                auVar307 = ZEXT1664(auVar164);
                fVar242 = auVar186._0_4_ + auVar123._0_4_;
                auVar126._0_4_ = auVar122._0_4_ * auVar122._0_4_;
                auVar126._4_4_ = auVar122._4_4_ * auVar122._4_4_;
                auVar126._8_4_ = auVar122._8_4_ * auVar122._8_4_;
                auVar126._12_4_ = auVar122._12_4_ * auVar122._12_4_;
                auVar129 = vdpps_avx(_local_ae0,local_9e0._0_16_,0x7f);
                auVar123 = vsubps_avx(auVar6,auVar126);
                auVar186 = vrsqrtss_avx(auVar123,auVar123);
                fVar308 = auVar123._0_4_;
                fVar245 = auVar186._0_4_;
                fVar245 = fVar245 * 1.5 + fVar308 * -0.5 * fVar245 * fVar245 * fVar245;
                auVar186 = vdpps_avx(_local_ae0,local_a50,0x7f);
                local_9e0._0_16_ = vfnmadd231ss_fma(auVar129,auVar122,ZEXT416((uint)fVar242));
                auVar129 = vfnmadd231ss_fma(auVar186,auVar122,local_a80._0_16_);
                if (fVar308 < 0.0) {
                  local_aa0._0_16_ = auVar122;
                  local_a20._0_4_ = auVar164._0_4_;
                  local_7a0._0_16_ = ZEXT416((uint)fVar242);
                  local_7c0._0_4_ = fVar245;
                  local_7e0._0_16_ = auVar129;
                  fVar308 = sqrtf(fVar308);
                  auVar307 = ZEXT464((uint)local_a20._0_4_);
                  auVar281 = ZEXT416((uint)local_b20._0_4_);
                  fVar245 = (float)local_7c0._0_4_;
                  auVar129 = local_7e0._0_16_;
                  auVar122 = local_aa0._0_16_;
                  auVar186 = local_7a0._0_16_;
                }
                else {
                  auVar186 = vsqrtss_avx(auVar123,auVar123);
                  fVar308 = auVar186._0_4_;
                  auVar186 = ZEXT416((uint)fVar242);
                }
                auVar299 = ZEXT1664(local_b00._0_16_);
                auVar123 = vpermilps_avx(local_780._0_16_,0xff);
                auVar164 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
                auVar187 = vfmsub213ss_fma(local_9e0._0_16_,ZEXT416((uint)fVar245),auVar164);
                auVar262 = ZEXT1664(auVar187);
                auVar219._0_8_ = local_a80._0_8_ ^ 0x8000000080000000;
                auVar219._8_4_ = local_a80._8_4_ ^ 0x80000000;
                auVar219._12_4_ = local_a80._12_4_ ^ 0x80000000;
                auVar235._0_8_ = auVar187._0_8_ ^ 0x8000000080000000;
                auVar235._8_4_ = auVar187._8_4_ ^ 0x80000000;
                auVar235._12_4_ = auVar187._12_4_ ^ 0x80000000;
                auVar129 = ZEXT416((uint)(auVar129._0_4_ * fVar245));
                auVar158 = vfmsub231ss_fma(ZEXT416((uint)(local_a80._0_4_ * auVar187._0_4_)),
                                           auVar186,auVar129);
                auVar129 = vinsertps_avx(auVar129,auVar219,0x10);
                uVar117 = auVar158._0_4_;
                auVar220._4_4_ = uVar117;
                auVar220._0_4_ = uVar117;
                auVar220._8_4_ = uVar117;
                auVar220._12_4_ = uVar117;
                auVar129 = vdivps_avx(auVar129,auVar220);
                auVar158 = ZEXT416((uint)(fVar308 - auVar123._0_4_));
                auVar123 = vinsertps_avx(auVar122,auVar158,0x10);
                auVar191._0_4_ = auVar123._0_4_ * auVar129._0_4_;
                auVar191._4_4_ = auVar123._4_4_ * auVar129._4_4_;
                auVar191._8_4_ = auVar123._8_4_ * auVar129._8_4_;
                auVar191._12_4_ = auVar123._12_4_ * auVar129._12_4_;
                auVar129 = vinsertps_avx(auVar235,auVar186,0x1c);
                auVar129 = vdivps_avx(auVar129,auVar220);
                auVar221._0_4_ = auVar123._0_4_ * auVar129._0_4_;
                auVar221._4_4_ = auVar123._4_4_ * auVar129._4_4_;
                auVar221._8_4_ = auVar123._8_4_ * auVar129._8_4_;
                auVar221._12_4_ = auVar123._12_4_ * auVar129._12_4_;
                auVar129 = vhaddps_avx(auVar191,auVar191);
                auVar186 = vhaddps_avx(auVar221,auVar221);
                fVar244 = fVar244 - auVar129._0_4_;
                fVar232 = fVar232 - auVar186._0_4_;
                auVar294 = ZEXT464((uint)fVar232);
                auVar129 = vandps_avx(auVar122,local_a00._0_16_);
                if (auVar307._0_4_ <= auVar129._0_4_) {
LAB_0195a80d:
                  bVar61 = false;
                }
                else {
                  auVar129 = vfmadd231ss_fma(ZEXT416((uint)(auVar281._0_4_ + auVar307._0_4_)),
                                             local_840._0_16_,ZEXT416(0x36000000));
                  auVar281 = vandps_avx(auVar158,local_a00._0_16_);
                  if (auVar129._0_4_ <= auVar281._0_4_) goto LAB_0195a80d;
                  fVar232 = fVar232 + (float)local_960._0_4_;
                  auVar294 = ZEXT464((uint)fVar232);
                  bVar61 = true;
                  if ((((fVar120 <= fVar232) &&
                       (fVar242 = *(float *)(ray + k * 4 + 0x100), fVar232 <= fVar242)) &&
                      (0.0 <= fVar244)) && (fVar244 <= 1.0)) {
                    auVar6 = vrsqrtss_avx(auVar6,auVar6);
                    fVar245 = auVar6._0_4_;
                    auVar114 = (undefined1  [8])(context->scene->geometries).items[uVar108].ptr;
                    if ((((Geometry *)auVar114)->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar243 = fVar245 * 1.5 + fVar243 * -0.5 * fVar245 * fVar245 * fVar245;
                      auVar159._0_4_ = fVar243 * (float)local_ae0._0_4_;
                      auVar159._4_4_ = fVar243 * (float)local_ae0._4_4_;
                      auVar159._8_4_ = fVar243 * fStack_ad8;
                      auVar159._12_4_ = fVar243 * fStack_ad4;
                      auVar122 = vfmadd213ps_fma(auVar164,auVar159,local_b00._0_16_);
                      auVar6 = vshufps_avx(auVar159,auVar159,0xc9);
                      auVar281 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                      auVar160._0_4_ = auVar159._0_4_ * auVar281._0_4_;
                      auVar160._4_4_ = auVar159._4_4_ * auVar281._4_4_;
                      auVar160._8_4_ = auVar159._8_4_ * auVar281._8_4_;
                      auVar160._12_4_ = auVar159._12_4_ * auVar281._12_4_;
                      auVar129 = vfmsub231ps_fma(auVar160,local_b00._0_16_,auVar6);
                      auVar6 = vshufps_avx(auVar129,auVar129,0xc9);
                      auVar281 = vshufps_avx(auVar122,auVar122,0xc9);
                      auVar129 = vshufps_avx(auVar129,auVar129,0xd2);
                      auVar127._0_4_ = auVar122._0_4_ * auVar129._0_4_;
                      auVar127._4_4_ = auVar122._4_4_ * auVar129._4_4_;
                      auVar127._8_4_ = auVar122._8_4_ * auVar129._8_4_;
                      auVar127._12_4_ = auVar122._12_4_ * auVar129._12_4_;
                      auVar6 = vfmsub231ps_fma(auVar127,auVar6,auVar281);
                      uVar117 = auVar6._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar114)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar232;
                        uVar8 = vextractps_avx(auVar6,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                        uVar8 = vextractps_avx(auVar6,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar117;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar244;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_aa8;
                        *(uint *)(ray + k * 4 + 0x240) = uVar108;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar13 = context->user;
                        auVar281 = vmovshdup_avx(auVar6);
                        auVar205._0_8_ = auVar281._0_8_;
                        auVar205._8_8_ = auVar205._0_8_;
                        auVar205._16_8_ = auVar205._0_8_;
                        auVar205._24_8_ = auVar205._0_8_;
                        auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
                        local_3c0 = auVar6._0_8_;
                        local_3e0[0] = (RTCHitN)(char)auVar205._0_8_;
                        local_3e0[1] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 8);
                        local_3e0[2] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x10);
                        local_3e0[3] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x18);
                        local_3e0[4] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x20);
                        local_3e0[5] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x28);
                        local_3e0[6] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x30);
                        local_3e0[7] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x38);
                        local_3e0[8] = (RTCHitN)(char)auVar205._0_8_;
                        local_3e0[9] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 8);
                        local_3e0[10] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x10);
                        local_3e0[0xb] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x18);
                        local_3e0[0xc] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x20);
                        local_3e0[0xd] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x28);
                        local_3e0[0xe] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x30);
                        local_3e0[0xf] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x38);
                        local_3e0[0x10] = (RTCHitN)(char)auVar205._0_8_;
                        local_3e0[0x11] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 8);
                        local_3e0[0x12] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x10);
                        local_3e0[0x13] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x18);
                        local_3e0[0x14] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x20);
                        local_3e0[0x15] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x28);
                        local_3e0[0x16] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x30);
                        local_3e0[0x17] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x38);
                        local_3e0[0x18] = (RTCHitN)(char)auVar205._0_8_;
                        local_3e0[0x19] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 8);
                        local_3e0[0x1a] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x10);
                        local_3e0[0x1b] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x18);
                        local_3e0[0x1c] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x20);
                        local_3e0[0x1d] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x28);
                        local_3e0[0x1e] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x30);
                        local_3e0[0x1f] = (RTCHitN)(char)((ulong)auVar205._0_8_ >> 0x38);
                        uStack_3b8 = local_3c0;
                        uStack_3b0 = local_3c0;
                        uStack_3a8 = local_3c0;
                        local_3a0 = uVar117;
                        uStack_39c = uVar117;
                        uStack_398 = uVar117;
                        uStack_394 = uVar117;
                        uStack_390 = uVar117;
                        uStack_38c = uVar117;
                        uStack_388 = uVar117;
                        uStack_384 = uVar117;
                        local_380 = fVar244;
                        fStack_37c = fVar244;
                        fStack_378 = fVar244;
                        fStack_374 = fVar244;
                        fStack_370 = fVar244;
                        fStack_36c = fVar244;
                        fStack_368 = fVar244;
                        fStack_364 = fVar244;
                        auVar161._12_4_ = 0;
                        auVar161._0_12_ = ZEXT412(0);
                        auVar161 = auVar161 << 0x20;
                        local_360 = ZEXT1232(ZEXT412(0)) << 0x20;
                        local_340 = CONCAT44(uStack_5fc,local_600);
                        uStack_338 = CONCAT44(uStack_5f4,uStack_5f8);
                        uStack_330 = CONCAT44(uStack_5ec,uStack_5f0);
                        uStack_328 = CONCAT44(uStack_5e4,uStack_5e8);
                        local_320 = CONCAT44(uStack_5dc,local_5e0);
                        uStack_318 = CONCAT44(uStack_5d4,uStack_5d8);
                        uStack_310 = CONCAT44(uStack_5cc,uStack_5d0);
                        uStack_308 = CONCAT44(uStack_5c4,uStack_5c8);
                        auVar168 = vpcmpeqd_avx2(auVar205,auVar205);
                        local_ab0[1] = auVar168;
                        *local_ab0 = auVar168;
                        local_300 = pRVar13->instID[0];
                        uStack_2fc = local_300;
                        uStack_2f8 = local_300;
                        uStack_2f4 = local_300;
                        uStack_2f0 = local_300;
                        uStack_2ec = local_300;
                        uStack_2e8 = local_300;
                        uStack_2e4 = local_300;
                        local_2e0 = pRVar13->instPrimID[0];
                        uStack_2dc = local_2e0;
                        uStack_2d8 = local_2e0;
                        uStack_2d4 = local_2e0;
                        uStack_2d0 = local_2e0;
                        uStack_2cc = local_2e0;
                        uStack_2c8 = local_2e0;
                        uStack_2c4 = local_2e0;
                        *(float *)(ray + k * 4 + 0x100) = fVar232;
                        local_9a0 = local_620._0_8_;
                        uStack_998 = local_620._8_8_;
                        uStack_990 = local_620._16_8_;
                        uStack_988 = local_620._24_8_;
                        local_b70.valid = (int *)&local_9a0;
                        local_b70.geometryUserPtr = ((Geometry *)auVar114)->userPtr;
                        local_b70.context = context->user;
                        local_b70.hit = local_3e0;
                        local_b70.N = 8;
                        local_b70.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar114)->intersectionFilterN != (RTCFilterFunctionN)0x0)
                        {
                          local_ae0 = auVar114;
                          auVar168 = ZEXT1632(auVar168._0_16_);
                          auVar262 = ZEXT1664(auVar187);
                          auVar299 = ZEXT1664(local_b00._0_16_);
                          auVar307 = ZEXT1664(auVar307._0_16_);
                          (*((Geometry *)auVar114)->intersectionFilterN)(&local_b70);
                          auVar168 = vpcmpeqd_avx2(auVar168,auVar168);
                          auVar161 = ZEXT816(0) << 0x40;
                          auVar114 = local_ae0;
                        }
                        auVar81._8_8_ = uStack_998;
                        auVar81._0_8_ = local_9a0;
                        auVar81._16_8_ = uStack_990;
                        auVar81._24_8_ = uStack_988;
                        auVar144 = vpcmpeqd_avx2(ZEXT1632(auVar161),auVar81);
                        auVar133 = auVar168 & ~auVar144;
                        if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar133 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar133 >> 0x7f,0) == '\0')
                              && (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar133 >> 0xbf,0) == '\0') &&
                            (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar133[0x1f]) {
                          auVar144 = auVar144 ^ auVar168;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar114)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar168 = ZEXT1632(auVar168._0_16_);
                            auVar262 = ZEXT1664(auVar262._0_16_);
                            auVar299 = ZEXT1664(auVar299._0_16_);
                            auVar307 = ZEXT1664(auVar307._0_16_);
                            (*p_Var14)(&local_b70);
                            auVar168 = vpcmpeqd_avx2(auVar168,auVar168);
                          }
                          auVar82._8_8_ = uStack_998;
                          auVar82._0_8_ = local_9a0;
                          auVar82._16_8_ = uStack_990;
                          auVar82._24_8_ = uStack_988;
                          auVar19 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar82
                                                 );
                          auVar144 = auVar19 ^ auVar168;
                          auVar133 = auVar168 & ~auVar19;
                          if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar133 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar133 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar133 >> 0x7f,0) != '\0') ||
                                (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar133 >> 0xbf,0) != '\0') ||
                              (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar133[0x1f] < '\0') {
                            auVar177._0_4_ = auVar19._0_4_ ^ auVar168._0_4_;
                            auVar177._4_4_ = auVar19._4_4_ ^ auVar168._4_4_;
                            auVar177._8_4_ = auVar19._8_4_ ^ auVar168._8_4_;
                            auVar177._12_4_ = auVar19._12_4_ ^ auVar168._12_4_;
                            auVar177._16_4_ = auVar19._16_4_ ^ auVar168._16_4_;
                            auVar177._20_4_ = auVar19._20_4_ ^ auVar168._20_4_;
                            auVar177._24_4_ = auVar19._24_4_ ^ auVar168._24_4_;
                            auVar177._28_4_ = auVar19._28_4_ ^ auVar168._28_4_;
                            auVar168 = vmaskmovps_avx(auVar177,*(undefined1 (*) [32])local_b70.hit);
                            *(undefined1 (*) [32])(local_b70.ray + 0x180) = auVar168;
                            auVar168 = vmaskmovps_avx(auVar177,*(undefined1 (*) [32])
                                                                (local_b70.hit + 0x20));
                            *(undefined1 (*) [32])(local_b70.ray + 0x1a0) = auVar168;
                            auVar168 = vmaskmovps_avx(auVar177,*(undefined1 (*) [32])
                                                                (local_b70.hit + 0x40));
                            *(undefined1 (*) [32])(local_b70.ray + 0x1c0) = auVar168;
                            auVar168 = vmaskmovps_avx(auVar177,*(undefined1 (*) [32])
                                                                (local_b70.hit + 0x60));
                            *(undefined1 (*) [32])(local_b70.ray + 0x1e0) = auVar168;
                            auVar168 = vmaskmovps_avx(auVar177,*(undefined1 (*) [32])
                                                                (local_b70.hit + 0x80));
                            *(undefined1 (*) [32])(local_b70.ray + 0x200) = auVar168;
                            auVar168 = vpmaskmovd_avx2(auVar177,*(undefined1 (*) [32])
                                                                 (local_b70.hit + 0xa0));
                            *(undefined1 (*) [32])(local_b70.ray + 0x220) = auVar168;
                            auVar168 = vpmaskmovd_avx2(auVar177,*(undefined1 (*) [32])
                                                                 (local_b70.hit + 0xc0));
                            *(undefined1 (*) [32])(local_b70.ray + 0x240) = auVar168;
                            auVar168 = vpmaskmovd_avx2(auVar177,*(undefined1 (*) [32])
                                                                 (local_b70.hit + 0xe0));
                            *(undefined1 (*) [32])(local_b70.ray + 0x260) = auVar168;
                            auVar168 = vpmaskmovd_avx2(auVar177,*(undefined1 (*) [32])
                                                                 (local_b70.hit + 0x100));
                            *(undefined1 (*) [32])(local_b70.ray + 0x280) = auVar168;
                          }
                        }
                        auVar294 = ZEXT464((uint)fVar232);
                        if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar144 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar144 >> 0x7f,0) == '\0')
                              && (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar144 >> 0xbf,0) == '\0') &&
                            (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar144[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar242;
                        }
                      }
                    }
                  }
                }
                auVar286 = ZEXT464((uint)fVar244);
                bVar119 = lVar113 != 0;
                lVar113 = lVar113 + -1;
              } while ((!bVar61) && (bVar119));
              uVar117 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar145._4_4_ = uVar117;
              auVar145._0_4_ = uVar117;
              auVar145._8_4_ = uVar117;
              auVar145._12_4_ = uVar117;
              auVar145._16_4_ = uVar117;
              auVar145._20_4_ = uVar117;
              auVar145._24_4_ = uVar117;
              auVar145._28_4_ = uVar117;
              auVar133 = vcmpps_avx(_local_880,auVar145,2);
              auVar168 = vandps_avx(auVar133,local_700);
              auVar133 = local_700 & auVar133;
              uVar118 = local_740;
              local_700 = auVar168;
            } while ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar133 >> 0x7f,0) != '\0') ||
                       (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar133 >> 0xbf,0) != '\0') ||
                     (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar133[0x1f] < '\0');
          }
          auVar73._4_4_ = (float)local_760._4_4_ * (float)local_8c0._4_4_;
          auVar73._0_4_ = (float)local_760._0_4_ * (float)local_8c0._0_4_;
          auVar73._8_4_ = fStack_758 * fStack_8b8;
          auVar73._12_4_ = fStack_754 * fStack_8b4;
          auVar73._16_4_ = fStack_750 * fStack_8b0;
          auVar73._20_4_ = fStack_74c * fStack_8ac;
          auVar73._24_4_ = fStack_748 * fStack_8a8;
          auVar73._28_4_ = uStack_744;
          auVar6 = vfmadd132ps_fma(local_920,auVar73,_local_8a0);
          auVar6 = vfmadd132ps_fma(local_900,ZEXT1632(auVar6),_local_860);
          auVar168 = vandps_avx(ZEXT1632(auVar6),local_8e0);
          auVar178._8_4_ = 0x3e99999a;
          auVar178._0_8_ = 0x3e99999a3e99999a;
          auVar178._12_4_ = 0x3e99999a;
          auVar178._16_4_ = 0x3e99999a;
          auVar178._20_4_ = 0x3e99999a;
          auVar178._24_4_ = 0x3e99999a;
          auVar178._28_4_ = 0x3e99999a;
          auVar168 = vcmpps_avx(auVar168,auVar178,1);
          auVar133 = vorps_avx(auVar168,local_940);
          auVar179._0_4_ = auVar18._0_4_ + (float)local_820._0_4_;
          auVar179._4_4_ = auVar18._4_4_ + (float)local_820._4_4_;
          auVar179._8_4_ = auVar18._8_4_ + fStack_818;
          auVar179._12_4_ = auVar18._12_4_ + fStack_814;
          auVar179._16_4_ = auVar18._16_4_ + fStack_810;
          auVar179._20_4_ = auVar18._20_4_ + fStack_80c;
          auVar179._24_4_ = auVar18._24_4_ + fStack_808;
          auVar179._28_4_ = auVar18._28_4_ + fStack_804;
          uVar117 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar206._4_4_ = uVar117;
          auVar206._0_4_ = uVar117;
          auVar206._8_4_ = uVar117;
          auVar206._12_4_ = uVar117;
          auVar206._16_4_ = uVar117;
          auVar206._20_4_ = uVar117;
          auVar206._24_4_ = uVar117;
          auVar206._28_4_ = uVar117;
          auVar168 = vcmpps_avx(auVar179,auVar206,2);
          local_900 = vandps_avx(auVar168,local_6c0);
          auVar180._8_4_ = 3;
          auVar180._0_8_ = 0x300000003;
          auVar180._12_4_ = 3;
          auVar180._16_4_ = 3;
          auVar180._20_4_ = 3;
          auVar180._24_4_ = 3;
          auVar180._28_4_ = 3;
          auVar207._8_4_ = 2;
          auVar207._0_8_ = 0x200000002;
          auVar207._12_4_ = 2;
          auVar207._16_4_ = 2;
          auVar207._20_4_ = 2;
          auVar207._24_4_ = 2;
          auVar207._28_4_ = 2;
          auVar168 = vblendvps_avx(auVar207,auVar180,auVar133);
          local_920 = vpcmpgtd_avx2(auVar168,local_6e0);
          auVar168 = vpandn_avx2(local_920,local_900);
          auVar133 = local_900 & ~local_920;
          if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar133 >> 0x7f,0) != '\0') ||
                (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar133 >> 0xbf,0) != '\0') ||
              (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar133[0x1f] < '\0') {
            auVar281 = vminps_avx(auVar2,auVar4);
            auVar6 = vmaxps_avx(auVar2,auVar4);
            auVar129 = vminps_avx(auVar3,auVar5);
            auVar122 = vminps_avx(auVar281,auVar129);
            auVar281 = vmaxps_avx(auVar3,auVar5);
            auVar129 = vmaxps_avx(auVar6,auVar281);
            local_9e0._8_4_ = NAN;
            local_9e0._0_8_ = 0x7fffffff7fffffff;
            local_9e0._12_4_ = NAN;
            auVar6 = vandps_avx(auVar122,local_9e0._0_16_);
            auVar281 = vandps_avx(auVar129,local_9e0._0_16_);
            auVar6 = vmaxps_avx(auVar6,auVar281);
            auVar281 = vmovshdup_avx(auVar6);
            auVar281 = vmaxss_avx(auVar281,auVar6);
            auVar6 = vshufpd_avx(auVar6,auVar6,1);
            auVar6 = vmaxss_avx(auVar6,auVar281);
            local_9c0._0_4_ = auVar6._0_4_ * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar129,auVar129,0xff);
            local_840 = _local_2c0;
            local_880._4_4_ = (float)local_2c0._4_4_ + (float)local_820._4_4_;
            local_880._0_4_ = (float)local_2c0._0_4_ + (float)local_820._0_4_;
            fStack_878 = fStack_2b8 + fStack_818;
            fStack_874 = fStack_2b4 + fStack_814;
            fStack_870 = fStack_2b0 + fStack_810;
            fStack_86c = fStack_2ac + fStack_80c;
            fStack_868 = fStack_2a8 + fStack_808;
            fStack_864 = fStack_2a4 + fStack_804;
            do {
              auVar181._8_4_ = 0x7f800000;
              auVar181._0_8_ = 0x7f8000007f800000;
              auVar181._12_4_ = 0x7f800000;
              auVar181._16_4_ = 0x7f800000;
              auVar181._20_4_ = 0x7f800000;
              auVar181._24_4_ = 0x7f800000;
              auVar181._28_4_ = 0x7f800000;
              auVar133 = vblendvps_avx(auVar181,local_840,auVar168);
              auVar144 = vshufps_avx(auVar133,auVar133,0xb1);
              auVar144 = vminps_avx(auVar133,auVar144);
              auVar18 = vshufpd_avx(auVar144,auVar144,5);
              auVar144 = vminps_avx(auVar144,auVar18);
              auVar18 = vpermpd_avx2(auVar144,0x4e);
              auVar144 = vminps_avx(auVar144,auVar18);
              auVar144 = vcmpps_avx(auVar133,auVar144,0);
              auVar18 = auVar168 & auVar144;
              auVar133 = auVar168;
              if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar18 >> 0x7f,0) != '\0') ||
                    (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar18 >> 0xbf,0) != '\0') ||
                  (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar18[0x1f] < '\0') {
                auVar133 = vandps_avx(auVar144,auVar168);
              }
              uVar115 = vmovmskps_avx(auVar133);
              iVar109 = 0;
              for (; (uVar115 & 1) == 0; uVar115 = uVar115 >> 1 | 0x80000000) {
                iVar109 = iVar109 + 1;
              }
              uVar110 = iVar109 << 2;
              local_720 = auVar168;
              *(undefined4 *)(local_720 + uVar110) = 0;
              uVar115 = *(uint *)(local_660 + uVar110);
              uVar110 = *(uint *)(local_2a0 + uVar110);
              fVar232 = auVar16._0_4_;
              if ((float)local_a60._0_4_ < 0.0) {
                fVar232 = sqrtf((float)local_a60._0_4_);
              }
              auVar294 = ZEXT464(uVar110);
              auVar286 = ZEXT464(uVar115);
              local_a80._0_4_ = fVar232 * 1.9073486e-06;
              lVar113 = 4;
              do {
                fVar244 = auVar286._0_4_;
                fVar309 = 1.0 - fVar244;
                local_b00._0_16_ = ZEXT416((uint)fVar309);
                fVar245 = fVar309 * fVar309 * fVar309;
                fVar308 = fVar244 * fVar244;
                fVar243 = fVar244 * fVar308;
                auVar281 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar245),
                                           ZEXT416((uint)fVar243));
                fVar242 = fVar244 * fVar309;
                auVar129 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * fVar242 * 6.0)),
                                           ZEXT416((uint)(fVar309 * fVar242)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar122 = vfmadd231ss_fma(ZEXT416((uint)(fVar309 * fVar242 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar244 * fVar242)));
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar243),
                                         ZEXT416((uint)fVar245));
                fVar232 = (auVar6._0_4_ + auVar122._0_4_) * 0.16666667;
                fVar243 = fVar243 * 0.16666667;
                auVar162._0_4_ = fVar243 * fVar149;
                auVar162._4_4_ = fVar243 * fStack_bac;
                auVar162._8_4_ = fVar243 * fStack_ba8;
                auVar162._12_4_ = fVar243 * fStack_ba4;
                auVar222._4_4_ = fVar232;
                auVar222._0_4_ = fVar232;
                auVar222._8_4_ = fVar232;
                auVar222._12_4_ = fVar232;
                auVar6 = vfmadd132ps_fma(auVar222,auVar162,auVar3);
                fVar232 = (auVar281._0_4_ + auVar129._0_4_) * 0.16666667;
                auVar163._4_4_ = fVar232;
                auVar163._0_4_ = fVar232;
                auVar163._8_4_ = fVar232;
                auVar163._12_4_ = fVar232;
                auVar6 = vfmadd132ps_fma(auVar163,auVar6,auVar4);
                fVar232 = auVar294._0_4_;
                auVar192._4_4_ = fVar232;
                auVar192._0_4_ = fVar232;
                auVar192._8_4_ = fVar232;
                auVar192._12_4_ = fVar232;
                auVar281 = vfmadd213ps_fma(auVar192,local_a50,_DAT_01feba10);
                fVar245 = fVar245 * 0.16666667;
                auVar128._4_4_ = fVar245;
                auVar128._0_4_ = fVar245;
                auVar128._8_4_ = fVar245;
                auVar128._12_4_ = fVar245;
                auVar6 = vfmadd132ps_fma(auVar128,auVar6,auVar2);
                local_780._0_16_ = auVar6;
                auVar6 = vsubps_avx(auVar281,auVar6);
                _local_ae0 = auVar6;
                auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
                fVar243 = auVar6._0_4_;
                auVar281 = auVar286._0_16_;
                if (fVar243 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)fVar309);
                  local_b20._0_4_ = fVar308;
                  local_b40._0_4_ = fVar242;
                  auVar299._0_4_ = sqrtf(fVar243);
                  auVar299._4_60_ = extraout_var_00;
                  auVar129 = auVar299._0_16_;
                  fVar242 = (float)local_b40._0_4_;
                  fVar308 = (float)local_b20._0_4_;
                }
                else {
                  auVar129 = vsqrtss_avx(auVar6,auVar6);
                }
                fVar245 = local_b00._0_4_;
                auVar130._4_4_ = fVar245;
                auVar130._0_4_ = fVar245;
                auVar130._8_4_ = fVar245;
                auVar130._12_4_ = fVar245;
                auVar186 = vfnmsub213ss_fma(auVar281,auVar281,ZEXT416((uint)(fVar242 * 4.0)));
                auVar122 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * 4.0)),local_b00._0_16_,
                                           local_b00._0_16_);
                fVar242 = fVar245 * -fVar245 * 0.5;
                fVar245 = auVar186._0_4_ * 0.5;
                fVar309 = auVar122._0_4_ * 0.5;
                fVar308 = fVar308 * 0.5;
                auVar251._0_4_ = fVar149 * fVar308;
                auVar251._4_4_ = fStack_bac * fVar308;
                auVar251._8_4_ = fStack_ba8 * fVar308;
                auVar251._12_4_ = fStack_ba4 * fVar308;
                auVar223._4_4_ = fVar309;
                auVar223._0_4_ = fVar309;
                auVar223._8_4_ = fVar309;
                auVar223._12_4_ = fVar309;
                auVar122 = vfmadd213ps_fma(auVar223,auVar3,auVar251);
                auVar236._4_4_ = fVar245;
                auVar236._0_4_ = fVar245;
                auVar236._8_4_ = fVar245;
                auVar236._12_4_ = fVar245;
                auVar122 = vfmadd213ps_fma(auVar236,auVar4,auVar122);
                auVar297._4_4_ = fVar242;
                auVar297._0_4_ = fVar242;
                auVar297._8_4_ = fVar242;
                auVar297._12_4_ = fVar242;
                auVar123 = vfmadd213ps_fma(auVar297,auVar2,auVar122);
                auVar122 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_b00._0_16_,auVar281)
                ;
                auVar281 = vfmadd231ss_fma(local_b00._0_16_,auVar281,SUB6416(ZEXT464(0xc0000000),0))
                ;
                auVar224._0_4_ = fVar149 * fVar244;
                auVar224._4_4_ = fStack_bac * fVar244;
                auVar224._8_4_ = fStack_ba8 * fVar244;
                auVar224._12_4_ = fStack_ba4 * fVar244;
                uVar117 = auVar281._0_4_;
                auVar237._4_4_ = uVar117;
                auVar237._0_4_ = uVar117;
                auVar237._8_4_ = uVar117;
                auVar237._12_4_ = uVar117;
                auVar281 = vfmadd213ps_fma(auVar237,auVar3,auVar224);
                auVar193._0_4_ = auVar122._0_4_;
                auVar193._4_4_ = auVar193._0_4_;
                auVar193._8_4_ = auVar193._0_4_;
                auVar193._12_4_ = auVar193._0_4_;
                auVar281 = vfmadd213ps_fma(auVar193,auVar4,auVar281);
                auVar164 = vfmadd231ps_fma(auVar281,auVar2,auVar130);
                auVar122 = vdpps_avx(auVar123,auVar123,0x7f);
                auVar281 = vblendps_avx(auVar122,_DAT_01feba10,0xe);
                auVar186 = vrsqrtss_avx(auVar281,auVar281);
                fVar242 = auVar186._0_4_;
                fVar308 = auVar122._0_4_;
                fVar242 = fVar242 * 1.5 + fVar308 * -0.5 * fVar242 * fVar242 * fVar242;
                auVar186 = vdpps_avx(auVar123,auVar164,0x7f);
                auVar194._0_4_ = auVar164._0_4_ * fVar308;
                auVar194._4_4_ = auVar164._4_4_ * fVar308;
                auVar194._8_4_ = auVar164._8_4_ * fVar308;
                auVar194._12_4_ = auVar164._12_4_ * fVar308;
                fVar245 = auVar186._0_4_;
                auVar252._0_4_ = auVar123._0_4_ * fVar245;
                auVar252._4_4_ = auVar123._4_4_ * fVar245;
                fVar309 = auVar123._8_4_;
                auVar252._8_4_ = fVar309 * fVar245;
                fVar263 = auVar123._12_4_;
                auVar252._12_4_ = fVar263 * fVar245;
                auVar186 = vsubps_avx(auVar194,auVar252);
                auVar281 = vrcpss_avx(auVar281,auVar281);
                auVar164 = vfnmadd213ss_fma(auVar281,auVar122,ZEXT416(0x40000000));
                fVar245 = auVar281._0_4_ * auVar164._0_4_;
                auVar281 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                      ZEXT416((uint)(fVar232 * (float)local_a80._0_4_)));
                auVar258._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
                auVar258._8_4_ = -fVar309;
                auVar258._12_4_ = -fVar263;
                auVar225._0_4_ = fVar242 * auVar186._0_4_ * fVar245;
                auVar225._4_4_ = fVar242 * auVar186._4_4_ * fVar245;
                auVar225._8_4_ = fVar242 * auVar186._8_4_ * fVar245;
                auVar225._12_4_ = fVar242 * auVar186._12_4_ * fVar245;
                auVar282._0_4_ = auVar123._0_4_ * fVar242;
                auVar282._4_4_ = auVar123._4_4_ * fVar242;
                auVar282._8_4_ = fVar309 * fVar242;
                auVar282._12_4_ = fVar263 * fVar242;
                local_b00._0_16_ = auVar123;
                local_b20._0_4_ = auVar281._0_4_;
                if (fVar308 < -fVar308) {
                  local_b40._0_4_ = auVar129._0_4_;
                  local_a00._0_16_ = auVar282;
                  local_aa0._0_16_ = auVar225;
                  fVar242 = sqrtf(fVar308);
                  auVar281 = ZEXT416((uint)local_b20._0_4_);
                  auVar129 = ZEXT416((uint)local_b40._0_4_);
                  auVar225 = local_aa0._0_16_;
                  auVar282 = local_a00._0_16_;
                }
                else {
                  auVar122 = vsqrtss_avx(auVar122,auVar122);
                  fVar242 = auVar122._0_4_;
                }
                auVar122 = vdpps_avx(_local_ae0,auVar282,0x7f);
                auVar187 = vfmadd213ss_fma(ZEXT416((uint)local_9c0._0_4_),auVar129,auVar281);
                auVar186 = vdpps_avx(auVar258,auVar282,0x7f);
                auVar123 = vdpps_avx(_local_ae0,auVar225,0x7f);
                auVar164 = vdpps_avx(local_a50,auVar282,0x7f);
                auVar187 = vfmadd213ss_fma(ZEXT416((uint)(auVar129._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_9c0._0_4_ / fVar242)),
                                           auVar187);
                auVar307 = ZEXT1664(auVar187);
                fVar242 = auVar186._0_4_ + auVar123._0_4_;
                auVar131._0_4_ = auVar122._0_4_ * auVar122._0_4_;
                auVar131._4_4_ = auVar122._4_4_ * auVar122._4_4_;
                auVar131._8_4_ = auVar122._8_4_ * auVar122._8_4_;
                auVar131._12_4_ = auVar122._12_4_ * auVar122._12_4_;
                auVar129 = vdpps_avx(_local_ae0,auVar258,0x7f);
                auVar123 = vsubps_avx(auVar6,auVar131);
                auVar186 = vrsqrtss_avx(auVar123,auVar123);
                fVar308 = auVar123._0_4_;
                fVar245 = auVar186._0_4_;
                fVar245 = fVar245 * 1.5 + fVar308 * -0.5 * fVar245 * fVar245 * fVar245;
                auVar186 = vdpps_avx(_local_ae0,local_a50,0x7f);
                auVar129 = vfnmadd231ss_fma(auVar129,auVar122,ZEXT416((uint)fVar242));
                auVar186 = vfnmadd231ss_fma(auVar186,auVar122,auVar164);
                if (fVar308 < 0.0) {
                  local_b40._0_16_ = auVar122;
                  local_a00._0_16_ = ZEXT416((uint)fVar242);
                  local_aa0._0_16_ = auVar164;
                  local_a20._0_16_ = auVar129;
                  local_7a0._0_4_ = fVar245;
                  local_7c0._0_16_ = auVar186;
                  fVar308 = sqrtf(fVar308);
                  auVar307 = ZEXT464(auVar187._0_4_);
                  auVar281 = ZEXT416((uint)local_b20._0_4_);
                  fVar245 = (float)local_7a0._0_4_;
                  auVar186 = local_7c0._0_16_;
                  auVar122 = local_b40._0_16_;
                  auVar164 = local_aa0._0_16_;
                  auVar129 = local_a20._0_16_;
                  auVar123 = local_a00._0_16_;
                }
                else {
                  auVar123 = vsqrtss_avx(auVar123,auVar123);
                  fVar308 = auVar123._0_4_;
                  auVar123 = ZEXT416((uint)fVar242);
                }
                auVar299 = ZEXT1664(auVar122);
                auVar262 = ZEXT1664(local_b00._0_16_);
                auVar158 = vpermilps_avx(local_780._0_16_,0xff);
                auVar187 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
                auVar129 = vfmsub213ss_fma(auVar129,ZEXT416((uint)fVar245),auVar187);
                auVar226._0_8_ = auVar164._0_8_ ^ 0x8000000080000000;
                auVar226._8_4_ = auVar164._8_4_ ^ 0x80000000;
                auVar226._12_4_ = auVar164._12_4_ ^ 0x80000000;
                auVar238._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
                auVar238._8_4_ = auVar129._8_4_ ^ 0x80000000;
                auVar238._12_4_ = auVar129._12_4_ ^ 0x80000000;
                auVar195 = ZEXT416((uint)(auVar186._0_4_ * fVar245));
                auVar186 = vfmsub231ss_fma(ZEXT416((uint)(auVar164._0_4_ * auVar129._0_4_)),auVar123
                                           ,auVar195);
                auVar129 = vinsertps_avx(auVar195,auVar226,0x10);
                uVar117 = auVar186._0_4_;
                auVar227._4_4_ = uVar117;
                auVar227._0_4_ = uVar117;
                auVar227._8_4_ = uVar117;
                auVar227._12_4_ = uVar117;
                auVar129 = vdivps_avx(auVar129,auVar227);
                auVar164 = ZEXT416((uint)(fVar308 - auVar158._0_4_));
                auVar186 = vinsertps_avx(auVar122,auVar164,0x10);
                auVar196._0_4_ = auVar186._0_4_ * auVar129._0_4_;
                auVar196._4_4_ = auVar186._4_4_ * auVar129._4_4_;
                auVar196._8_4_ = auVar186._8_4_ * auVar129._8_4_;
                auVar196._12_4_ = auVar186._12_4_ * auVar129._12_4_;
                auVar129 = vinsertps_avx(auVar238,auVar123,0x1c);
                auVar129 = vdivps_avx(auVar129,auVar227);
                auVar228._0_4_ = auVar186._0_4_ * auVar129._0_4_;
                auVar228._4_4_ = auVar186._4_4_ * auVar129._4_4_;
                auVar228._8_4_ = auVar186._8_4_ * auVar129._8_4_;
                auVar228._12_4_ = auVar186._12_4_ * auVar129._12_4_;
                auVar129 = vhaddps_avx(auVar196,auVar196);
                auVar186 = vhaddps_avx(auVar228,auVar228);
                fVar244 = fVar244 - auVar129._0_4_;
                fVar232 = fVar232 - auVar186._0_4_;
                auVar294 = ZEXT464((uint)fVar232);
                auVar129 = vandps_avx(auVar122,local_9e0._0_16_);
                if (auVar307._0_4_ <= auVar129._0_4_) {
LAB_0195b42a:
                  bVar61 = false;
                }
                else {
                  auVar129 = vfmadd231ss_fma(ZEXT416((uint)(auVar281._0_4_ + auVar307._0_4_)),
                                             local_7e0._0_16_,ZEXT416(0x36000000));
                  auVar281 = vandps_avx(auVar164,local_9e0._0_16_);
                  if (auVar129._0_4_ <= auVar281._0_4_) goto LAB_0195b42a;
                  fVar232 = fVar232 + (float)local_960._0_4_;
                  auVar294 = ZEXT464((uint)fVar232);
                  bVar61 = true;
                  if ((((fVar120 <= fVar232) &&
                       (fVar242 = *(float *)(ray + k * 4 + 0x100), fVar232 <= fVar242)) &&
                      (0.0 <= fVar244)) && (fVar244 <= 1.0)) {
                    auVar6 = vrsqrtss_avx(auVar6,auVar6);
                    fVar245 = auVar6._0_4_;
                    auVar114 = (undefined1  [8])(context->scene->geometries).items[uVar108].ptr;
                    if ((((Geometry *)auVar114)->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar243 = fVar245 * 1.5 + fVar243 * -0.5 * fVar245 * fVar245 * fVar245;
                      auVar165._0_4_ = fVar243 * (float)local_ae0._0_4_;
                      auVar165._4_4_ = fVar243 * (float)local_ae0._4_4_;
                      auVar165._8_4_ = fVar243 * fStack_ad8;
                      auVar165._12_4_ = fVar243 * fStack_ad4;
                      auVar186 = vfmadd213ps_fma(auVar187,auVar165,local_b00._0_16_);
                      auVar6 = vshufps_avx(auVar165,auVar165,0xc9);
                      auVar281 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                      auVar166._0_4_ = auVar165._0_4_ * auVar281._0_4_;
                      auVar166._4_4_ = auVar165._4_4_ * auVar281._4_4_;
                      auVar166._8_4_ = auVar165._8_4_ * auVar281._8_4_;
                      auVar166._12_4_ = auVar165._12_4_ * auVar281._12_4_;
                      auVar129 = vfmsub231ps_fma(auVar166,local_b00._0_16_,auVar6);
                      auVar6 = vshufps_avx(auVar129,auVar129,0xc9);
                      auVar281 = vshufps_avx(auVar186,auVar186,0xc9);
                      auVar129 = vshufps_avx(auVar129,auVar129,0xd2);
                      auVar132._0_4_ = auVar186._0_4_ * auVar129._0_4_;
                      auVar132._4_4_ = auVar186._4_4_ * auVar129._4_4_;
                      auVar132._8_4_ = auVar186._8_4_ * auVar129._8_4_;
                      auVar132._12_4_ = auVar186._12_4_ * auVar129._12_4_;
                      auVar6 = vfmsub231ps_fma(auVar132,auVar6,auVar281);
                      uVar117 = auVar6._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar114)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar232;
                        uVar8 = vextractps_avx(auVar6,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                        uVar8 = vextractps_avx(auVar6,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar117;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar244;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_aa8;
                        *(uint *)(ray + k * 4 + 0x240) = uVar108;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar13 = context->user;
                        auVar281 = vmovshdup_avx(auVar6);
                        auVar208._0_8_ = auVar281._0_8_;
                        auVar208._8_8_ = auVar208._0_8_;
                        auVar208._16_8_ = auVar208._0_8_;
                        auVar208._24_8_ = auVar208._0_8_;
                        auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
                        local_3c0 = auVar6._0_8_;
                        local_3e0[0] = (RTCHitN)(char)auVar208._0_8_;
                        local_3e0[1] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 8);
                        local_3e0[2] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x10);
                        local_3e0[3] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x18);
                        local_3e0[4] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x20);
                        local_3e0[5] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x28);
                        local_3e0[6] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x30);
                        local_3e0[7] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x38);
                        local_3e0[8] = (RTCHitN)(char)auVar208._0_8_;
                        local_3e0[9] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 8);
                        local_3e0[10] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x10);
                        local_3e0[0xb] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x18);
                        local_3e0[0xc] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x20);
                        local_3e0[0xd] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x28);
                        local_3e0[0xe] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x30);
                        local_3e0[0xf] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x38);
                        local_3e0[0x10] = (RTCHitN)(char)auVar208._0_8_;
                        local_3e0[0x11] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 8);
                        local_3e0[0x12] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x10);
                        local_3e0[0x13] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x18);
                        local_3e0[0x14] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x20);
                        local_3e0[0x15] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x28);
                        local_3e0[0x16] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x30);
                        local_3e0[0x17] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x38);
                        local_3e0[0x18] = (RTCHitN)(char)auVar208._0_8_;
                        local_3e0[0x19] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 8);
                        local_3e0[0x1a] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x10);
                        local_3e0[0x1b] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x18);
                        local_3e0[0x1c] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x20);
                        local_3e0[0x1d] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x28);
                        local_3e0[0x1e] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x30);
                        local_3e0[0x1f] = (RTCHitN)(char)((ulong)auVar208._0_8_ >> 0x38);
                        uStack_3b8 = local_3c0;
                        uStack_3b0 = local_3c0;
                        uStack_3a8 = local_3c0;
                        local_3a0 = uVar117;
                        uStack_39c = uVar117;
                        uStack_398 = uVar117;
                        uStack_394 = uVar117;
                        uStack_390 = uVar117;
                        uStack_38c = uVar117;
                        uStack_388 = uVar117;
                        uStack_384 = uVar117;
                        local_380 = fVar244;
                        fStack_37c = fVar244;
                        fStack_378 = fVar244;
                        fStack_374 = fVar244;
                        fStack_370 = fVar244;
                        fStack_36c = fVar244;
                        fStack_368 = fVar244;
                        fStack_364 = fVar244;
                        auVar167._12_4_ = 0;
                        auVar167._0_12_ = ZEXT412(0);
                        auVar167 = auVar167 << 0x20;
                        local_360 = ZEXT1232(ZEXT412(0)) << 0x20;
                        local_340 = CONCAT44(uStack_5fc,local_600);
                        uStack_338 = CONCAT44(uStack_5f4,uStack_5f8);
                        uStack_330 = CONCAT44(uStack_5ec,uStack_5f0);
                        uStack_328 = CONCAT44(uStack_5e4,uStack_5e8);
                        local_320 = CONCAT44(uStack_5dc,local_5e0);
                        uStack_318 = CONCAT44(uStack_5d4,uStack_5d8);
                        uStack_310 = CONCAT44(uStack_5cc,uStack_5d0);
                        uStack_308 = CONCAT44(uStack_5c4,uStack_5c8);
                        auVar168 = vpcmpeqd_avx2(auVar208,auVar208);
                        local_ab0[1] = auVar168;
                        *local_ab0 = auVar168;
                        local_300 = pRVar13->instID[0];
                        uStack_2fc = local_300;
                        uStack_2f8 = local_300;
                        uStack_2f4 = local_300;
                        uStack_2f0 = local_300;
                        uStack_2ec = local_300;
                        uStack_2e8 = local_300;
                        uStack_2e4 = local_300;
                        local_2e0 = pRVar13->instPrimID[0];
                        uStack_2dc = local_2e0;
                        uStack_2d8 = local_2e0;
                        uStack_2d4 = local_2e0;
                        uStack_2d0 = local_2e0;
                        uStack_2cc = local_2e0;
                        uStack_2c8 = local_2e0;
                        uStack_2c4 = local_2e0;
                        *(float *)(ray + k * 4 + 0x100) = fVar232;
                        local_9a0 = local_620._0_8_;
                        uStack_998 = local_620._8_8_;
                        uStack_990 = local_620._16_8_;
                        uStack_988 = local_620._24_8_;
                        local_b70.valid = (int *)&local_9a0;
                        local_b70.geometryUserPtr = ((Geometry *)auVar114)->userPtr;
                        local_b70.context = context->user;
                        local_b70.hit = local_3e0;
                        local_b70.N = 8;
                        local_b70.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar114)->intersectionFilterN != (RTCFilterFunctionN)0x0)
                        {
                          local_ae0 = auVar114;
                          auVar168 = ZEXT1632(auVar168._0_16_);
                          auVar262 = ZEXT1664(local_b00._0_16_);
                          auVar299 = ZEXT1664(auVar122);
                          auVar307 = ZEXT1664(auVar307._0_16_);
                          (*((Geometry *)auVar114)->intersectionFilterN)(&local_b70);
                          auVar168 = vpcmpeqd_avx2(auVar168,auVar168);
                          auVar167 = ZEXT816(0) << 0x40;
                          auVar114 = local_ae0;
                        }
                        auVar83._8_8_ = uStack_998;
                        auVar83._0_8_ = local_9a0;
                        auVar83._16_8_ = uStack_990;
                        auVar83._24_8_ = uStack_988;
                        auVar144 = vpcmpeqd_avx2(ZEXT1632(auVar167),auVar83);
                        auVar133 = auVar168 & ~auVar144;
                        if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar133 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar133 >> 0x7f,0) == '\0')
                              && (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar133 >> 0xbf,0) == '\0') &&
                            (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar133[0x1f]) {
                          auVar144 = auVar144 ^ auVar168;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar114)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar168 = ZEXT1632(auVar168._0_16_);
                            auVar262 = ZEXT1664(auVar262._0_16_);
                            auVar299 = ZEXT1664(auVar299._0_16_);
                            auVar307 = ZEXT1664(auVar307._0_16_);
                            (*p_Var14)(&local_b70);
                            auVar168 = vpcmpeqd_avx2(auVar168,auVar168);
                          }
                          auVar84._8_8_ = uStack_998;
                          auVar84._0_8_ = local_9a0;
                          auVar84._16_8_ = uStack_990;
                          auVar84._24_8_ = uStack_988;
                          auVar18 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar84
                                                 );
                          auVar144 = auVar18 ^ auVar168;
                          auVar133 = auVar168 & ~auVar18;
                          if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar133 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar133 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar133 >> 0x7f,0) != '\0') ||
                                (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar133 >> 0xbf,0) != '\0') ||
                              (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar133[0x1f] < '\0') {
                            auVar182._0_4_ = auVar18._0_4_ ^ auVar168._0_4_;
                            auVar182._4_4_ = auVar18._4_4_ ^ auVar168._4_4_;
                            auVar182._8_4_ = auVar18._8_4_ ^ auVar168._8_4_;
                            auVar182._12_4_ = auVar18._12_4_ ^ auVar168._12_4_;
                            auVar182._16_4_ = auVar18._16_4_ ^ auVar168._16_4_;
                            auVar182._20_4_ = auVar18._20_4_ ^ auVar168._20_4_;
                            auVar182._24_4_ = auVar18._24_4_ ^ auVar168._24_4_;
                            auVar182._28_4_ = auVar18._28_4_ ^ auVar168._28_4_;
                            auVar168 = vmaskmovps_avx(auVar182,*(undefined1 (*) [32])local_b70.hit);
                            *(undefined1 (*) [32])(local_b70.ray + 0x180) = auVar168;
                            auVar168 = vmaskmovps_avx(auVar182,*(undefined1 (*) [32])
                                                                (local_b70.hit + 0x20));
                            *(undefined1 (*) [32])(local_b70.ray + 0x1a0) = auVar168;
                            auVar168 = vmaskmovps_avx(auVar182,*(undefined1 (*) [32])
                                                                (local_b70.hit + 0x40));
                            *(undefined1 (*) [32])(local_b70.ray + 0x1c0) = auVar168;
                            auVar168 = vmaskmovps_avx(auVar182,*(undefined1 (*) [32])
                                                                (local_b70.hit + 0x60));
                            *(undefined1 (*) [32])(local_b70.ray + 0x1e0) = auVar168;
                            auVar168 = vmaskmovps_avx(auVar182,*(undefined1 (*) [32])
                                                                (local_b70.hit + 0x80));
                            *(undefined1 (*) [32])(local_b70.ray + 0x200) = auVar168;
                            auVar168 = vpmaskmovd_avx2(auVar182,*(undefined1 (*) [32])
                                                                 (local_b70.hit + 0xa0));
                            *(undefined1 (*) [32])(local_b70.ray + 0x220) = auVar168;
                            auVar168 = vpmaskmovd_avx2(auVar182,*(undefined1 (*) [32])
                                                                 (local_b70.hit + 0xc0));
                            *(undefined1 (*) [32])(local_b70.ray + 0x240) = auVar168;
                            auVar168 = vpmaskmovd_avx2(auVar182,*(undefined1 (*) [32])
                                                                 (local_b70.hit + 0xe0));
                            *(undefined1 (*) [32])(local_b70.ray + 0x260) = auVar168;
                            auVar168 = vpmaskmovd_avx2(auVar182,*(undefined1 (*) [32])
                                                                 (local_b70.hit + 0x100));
                            *(undefined1 (*) [32])(local_b70.ray + 0x280) = auVar168;
                          }
                        }
                        auVar294 = ZEXT464((uint)fVar232);
                        if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar144 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar144 >> 0x7f,0) == '\0')
                              && (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar144 >> 0xbf,0) == '\0') &&
                            (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar144[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar242;
                        }
                      }
                    }
                  }
                }
                auVar286 = ZEXT464((uint)fVar244);
                bVar119 = lVar113 != 0;
                lVar113 = lVar113 + -1;
              } while ((!bVar61) && (bVar119));
              uVar117 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar146._4_4_ = uVar117;
              auVar146._0_4_ = uVar117;
              auVar146._8_4_ = uVar117;
              auVar146._12_4_ = uVar117;
              auVar146._16_4_ = uVar117;
              auVar146._20_4_ = uVar117;
              auVar146._24_4_ = uVar117;
              auVar146._28_4_ = uVar117;
              auVar133 = vcmpps_avx(_local_880,auVar146,2);
              auVar168 = vandps_avx(auVar133,local_720);
              local_720 = local_720 & auVar133;
              uVar118 = local_740;
            } while ((((((((local_720 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_720 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_720 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_720 >> 0x7f,0) != '\0') ||
                       (local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_720 >> 0xbf,0) != '\0') ||
                     (local_720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_720[0x1f] < '\0');
          }
          auVar183._0_4_ = (float)local_820._0_4_ + local_420._0_4_;
          auVar183._4_4_ = (float)local_820._4_4_ + local_420._4_4_;
          auVar183._8_4_ = fStack_818 + local_420._8_4_;
          auVar183._12_4_ = fStack_814 + local_420._12_4_;
          auVar183._16_4_ = fStack_810 + local_420._16_4_;
          auVar183._20_4_ = fStack_80c + local_420._20_4_;
          auVar183._24_4_ = fStack_808 + local_420._24_4_;
          auVar183._28_4_ = fStack_804 + local_420._28_4_;
          uVar117 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar230._4_4_ = uVar117;
          auVar230._0_4_ = uVar117;
          auVar230._8_4_ = uVar117;
          auVar230._12_4_ = uVar117;
          auVar230._16_4_ = uVar117;
          auVar230._20_4_ = uVar117;
          auVar230._24_4_ = uVar117;
          auVar230._28_4_ = uVar117;
          auVar133 = vcmpps_avx(auVar183,auVar230,2);
          auVar168 = vandps_avx(local_6a0,local_680);
          auVar168 = vandps_avx(auVar133,auVar168);
          auVar240._0_4_ = (float)local_820._0_4_ + local_2c0._0_4_;
          auVar240._4_4_ = (float)local_820._4_4_ + local_2c0._4_4_;
          auVar240._8_4_ = fStack_818 + local_2c0._8_4_;
          auVar240._12_4_ = fStack_814 + local_2c0._12_4_;
          auVar240._16_4_ = fStack_810 + local_2c0._16_4_;
          auVar240._20_4_ = fStack_80c + local_2c0._20_4_;
          auVar240._24_4_ = fStack_808 + local_2c0._24_4_;
          auVar240._28_4_ = fStack_804 + local_2c0._28_4_;
          auVar144 = vcmpps_avx(auVar240,auVar230,2);
          auVar133 = vandps_avx(local_920,local_900);
          auVar133 = vandps_avx(auVar144,auVar133);
          auVar133 = vorps_avx(auVar168,auVar133);
          if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar133 >> 0x7f,0) != '\0') ||
                (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar133 >> 0xbf,0) != '\0') ||
              (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar133[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar111 * 0x60) = auVar133;
            auVar168 = vblendvps_avx(_local_2c0,local_420,auVar168);
            *(undefined1 (*) [32])(auStack_160 + uVar111 * 0x60) = auVar168;
            auVar86._8_8_ = uStack_968;
            auVar86._0_8_ = local_970;
            uVar185 = vmovlps_avx(auVar86);
            *(undefined8 *)(afStack_140 + uVar111 * 0x18) = uVar185;
            auStack_138[uVar111 * 0x18] = (int)uVar118 + 1;
            uVar111 = (ulong)((int)uVar111 + 1);
          }
        }
        goto LAB_01959875;
      }
    }
    do {
      if ((int)uVar111 == 0) {
        uVar117 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar148._4_4_ = uVar117;
        auVar148._0_4_ = uVar117;
        auVar148._8_4_ = uVar117;
        auVar148._12_4_ = uVar117;
        auVar148._16_4_ = uVar117;
        auVar148._20_4_ = uVar117;
        auVar148._24_4_ = uVar117;
        auVar148._28_4_ = uVar117;
        auVar168 = vcmpps_avx(local_280,auVar148,2);
        uVar108 = vmovmskps_avx(auVar168);
        uVar108 = uVar108 & (uint)local_948 - 1 & (uint)local_948;
        if (uVar108 == 0) {
          return;
        }
        goto LAB_01958e22;
      }
      uVar112 = (ulong)((int)uVar111 - 1);
      lVar113 = uVar112 * 0x60;
      auVar168 = *(undefined1 (*) [32])(auStack_160 + lVar113);
      auVar141._0_4_ = auVar168._0_4_ + (float)local_820._0_4_;
      auVar141._4_4_ = auVar168._4_4_ + (float)local_820._4_4_;
      auVar141._8_4_ = auVar168._8_4_ + fStack_818;
      auVar141._12_4_ = auVar168._12_4_ + fStack_814;
      auVar141._16_4_ = auVar168._16_4_ + fStack_810;
      auVar141._20_4_ = auVar168._20_4_ + fStack_80c;
      auVar141._24_4_ = auVar168._24_4_ + fStack_808;
      auVar141._28_4_ = auVar168._28_4_ + fStack_804;
      uVar117 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar229._4_4_ = uVar117;
      auVar229._0_4_ = uVar117;
      auVar229._8_4_ = uVar117;
      auVar229._12_4_ = uVar117;
      auVar229._16_4_ = uVar117;
      auVar229._20_4_ = uVar117;
      auVar229._24_4_ = uVar117;
      auVar229._28_4_ = uVar117;
      auVar144 = vcmpps_avx(auVar141,auVar229,2);
      auVar133 = vandps_avx(auVar144,*(undefined1 (*) [32])(auStack_180 + lVar113));
      local_3e0[0] = (RTCHitN)auVar133[0];
      local_3e0[1] = (RTCHitN)auVar133[1];
      local_3e0[2] = (RTCHitN)auVar133[2];
      local_3e0[3] = (RTCHitN)auVar133[3];
      local_3e0[4] = (RTCHitN)auVar133[4];
      local_3e0[5] = (RTCHitN)auVar133[5];
      local_3e0[6] = (RTCHitN)auVar133[6];
      local_3e0[7] = (RTCHitN)auVar133[7];
      local_3e0[8] = (RTCHitN)auVar133[8];
      local_3e0[9] = (RTCHitN)auVar133[9];
      local_3e0[10] = (RTCHitN)auVar133[10];
      local_3e0[0xb] = (RTCHitN)auVar133[0xb];
      local_3e0[0xc] = (RTCHitN)auVar133[0xc];
      local_3e0[0xd] = (RTCHitN)auVar133[0xd];
      local_3e0[0xe] = (RTCHitN)auVar133[0xe];
      local_3e0[0xf] = (RTCHitN)auVar133[0xf];
      local_3e0[0x10] = (RTCHitN)auVar133[0x10];
      local_3e0[0x11] = (RTCHitN)auVar133[0x11];
      local_3e0[0x12] = (RTCHitN)auVar133[0x12];
      local_3e0[0x13] = (RTCHitN)auVar133[0x13];
      local_3e0[0x14] = (RTCHitN)auVar133[0x14];
      local_3e0[0x15] = (RTCHitN)auVar133[0x15];
      local_3e0[0x16] = (RTCHitN)auVar133[0x16];
      local_3e0[0x17] = (RTCHitN)auVar133[0x17];
      local_3e0[0x18] = (RTCHitN)auVar133[0x18];
      local_3e0[0x19] = (RTCHitN)auVar133[0x19];
      local_3e0[0x1a] = (RTCHitN)auVar133[0x1a];
      local_3e0[0x1b] = (RTCHitN)auVar133[0x1b];
      local_3e0[0x1c] = (RTCHitN)auVar133[0x1c];
      local_3e0[0x1d] = (RTCHitN)auVar133[0x1d];
      local_3e0[0x1e] = (RTCHitN)auVar133[0x1e];
      local_3e0[0x1f] = (RTCHitN)auVar133[0x1f];
      auVar144 = *(undefined1 (*) [32])(auStack_180 + lVar113) & auVar144;
      bVar79 = (auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar80 = (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar78 = (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar77 = SUB321(auVar144 >> 0x7f,0) == '\0';
      bVar76 = (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar75 = SUB321(auVar144 >> 0xbf,0) == '\0';
      bVar119 = (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar61 = -1 < auVar144[0x1f];
      if (((((((!bVar79 || !bVar80) || !bVar78) || !bVar77) || !bVar76) || !bVar75) || !bVar119) ||
          !bVar61) {
        auVar202._8_4_ = 0x7f800000;
        auVar202._0_8_ = 0x7f8000007f800000;
        auVar202._12_4_ = 0x7f800000;
        auVar202._16_4_ = 0x7f800000;
        auVar202._20_4_ = 0x7f800000;
        auVar202._24_4_ = 0x7f800000;
        auVar202._28_4_ = 0x7f800000;
        auVar168 = vblendvps_avx(auVar202,auVar168,auVar133);
        auVar144 = vshufps_avx(auVar168,auVar168,0xb1);
        auVar144 = vminps_avx(auVar168,auVar144);
        auVar18 = vshufpd_avx(auVar144,auVar144,5);
        auVar144 = vminps_avx(auVar144,auVar18);
        auVar18 = vpermpd_avx2(auVar144,0x4e);
        auVar144 = vminps_avx(auVar144,auVar18);
        auVar168 = vcmpps_avx(auVar168,auVar144,0);
        auVar144 = auVar133 & auVar168;
        if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar144 >> 0x7f,0) != '\0') ||
              (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0xbf,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar144[0x1f] < '\0') {
          auVar133 = vandps_avx(auVar168,auVar133);
        }
        fVar232 = afStack_140[uVar112 * 0x18 + 1];
        uVar118 = (ulong)auStack_138[uVar112 * 0x18];
        uVar115 = vmovmskps_avx(auVar133);
        iVar109 = 0;
        for (; (uVar115 & 1) == 0; uVar115 = uVar115 >> 1 | 0x80000000) {
          iVar109 = iVar109 + 1;
        }
        fVar242 = afStack_140[uVar112 * 0x18];
        auVar142._4_4_ = fVar242;
        auVar142._0_4_ = fVar242;
        auVar142._8_4_ = fVar242;
        auVar142._12_4_ = fVar242;
        auVar142._16_4_ = fVar242;
        auVar142._20_4_ = fVar242;
        auVar142._24_4_ = fVar242;
        auVar142._28_4_ = fVar242;
        *(undefined4 *)(local_3e0 + (uint)(iVar109 << 2)) = 0;
        *(RTCHitN (*) [32])(auStack_180 + lVar113) = local_3e0;
        if (((((((((undefined1  [32])local_3e0 >> 0x1f & (undefined1  [32])0x1) !=
                  (undefined1  [32])0x0 ||
                 ((undefined1  [32])local_3e0 >> 0x3f & (undefined1  [32])0x1) !=
                 (undefined1  [32])0x0) ||
                ((undefined1  [32])local_3e0 >> 0x5f & (undefined1  [32])0x1) !=
                (undefined1  [32])0x0) || SUB321((undefined1  [32])local_3e0 >> 0x7f,0) != '\0') ||
              ((undefined1  [32])local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
              ) || SUB321((undefined1  [32])local_3e0 >> 0xbf,0) != '\0') ||
            ((undefined1  [32])local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
            || local_3e0[0x1f] < '\0') {
          uVar112 = uVar111;
        }
        fVar232 = fVar232 - fVar242;
        auVar172._4_4_ = fVar232;
        auVar172._0_4_ = fVar232;
        auVar172._8_4_ = fVar232;
        auVar172._12_4_ = fVar232;
        auVar172._16_4_ = fVar232;
        auVar172._20_4_ = fVar232;
        auVar172._24_4_ = fVar232;
        auVar172._28_4_ = fVar232;
        auVar6 = vfmadd132ps_fma(auVar172,auVar142,_DAT_02020f20);
        local_420 = ZEXT1632(auVar6);
        local_970 = *(undefined8 *)(local_420 + (uint)(iVar109 << 2));
        uStack_968 = 0;
      }
      uVar111 = uVar112;
    } while (((((((bVar79 && bVar80) && bVar78) && bVar77) && bVar76) && bVar75) && bVar119) &&
             bVar61);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }